

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx2::CurveNiIntersectorK<4,4>::
     occluded_n<embree::avx2::OrientedCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx2::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  BBox1f BVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  Primitive PVar4;
  uint uVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  void *pvVar8;
  __int_type_conflict _Var9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  int iVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  LinearSpace3fa *pLVar48;
  uint uVar49;
  ulong uVar50;
  long lVar51;
  byte bVar52;
  uint uVar53;
  uint uVar54;
  ulong uVar55;
  bool bVar56;
  ulong uVar57;
  bool bVar58;
  float fVar59;
  undefined4 uVar60;
  float fVar61;
  float fVar84;
  float fVar86;
  vint4 bi_2;
  undefined1 auVar62 [16];
  float fVar88;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar85;
  float fVar87;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined8 uVar89;
  vint4 bi_1;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  float fVar124;
  vint4 ai_2;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  float fVar137;
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  float fVar138;
  vint4 ai;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [32];
  float fVar149;
  vint4 bi;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [32];
  float fVar166;
  float fVar184;
  float fVar185;
  vint4 ai_1;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  float fVar186;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [32];
  float fVar197;
  float fVar198;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar191 [16];
  float fVar200;
  float fVar201;
  float fVar202;
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  float fVar199;
  undefined1 auVar196 [32];
  float fVar203;
  float fVar215;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  float fVar216;
  float fVar232;
  vfloat4 a0_2;
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  float fVar233;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [32];
  undefined1 auVar231 [64];
  vfloat4 a0_3;
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  vfloat4 a0_1;
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar253 [16];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  float fVar262;
  float fVar271;
  float fVar272;
  vfloat4 a0;
  float fVar273;
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [32];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar274 [16];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar285 [32];
  vfloat_impl<4> p00;
  undefined1 local_628 [8];
  undefined8 uStack_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined1 local_578 [32];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  undefined1 local_538 [16];
  undefined1 (*local_520) [16];
  LinearSpace3fa *local_518;
  ulong local_510;
  undefined1 local_508 [8];
  float fStack_500;
  float fStack_4fc;
  undefined1 auStack_4f8 [16];
  undefined1 local_4e8 [32];
  undefined1 local_4c8 [8];
  float fStack_4c0;
  float fStack_4bc;
  undefined1 local_4b8 [8];
  float fStack_4b0;
  float fStack_4ac;
  undefined1 local_4a8 [16];
  undefined1 local_498 [16];
  undefined1 local_488 [16];
  undefined1 local_478 [8];
  float fStack_470;
  float fStack_46c;
  undefined1 local_468 [16];
  undefined1 local_458 [16];
  undefined1 local_448 [16];
  uint local_438;
  uint uStack_434;
  uint uStack_430;
  uint uStack_42c;
  undefined1 local_428 [16];
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  float fStack_400;
  float fStack_3fc;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  RTCHitN local_248 [16];
  undefined1 local_238 [16];
  undefined4 local_228;
  undefined4 uStack_224;
  undefined4 uStack_220;
  undefined4 uStack_21c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [16];
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined1 local_1e8 [16];
  uint local_1d8;
  uint uStack_1d4;
  uint uStack_1d0;
  uint uStack_1cc;
  uint uStack_1c8;
  uint uStack_1c4;
  uint uStack_1c0;
  uint uStack_1bc;
  undefined1 local_1b8 [32];
  undefined1 local_198 [32];
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  undefined4 uStack_13c;
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  BBox1f cv_stack [4];
  undefined1 auVar284 [32];
  
  PVar4 = prim[1];
  uVar50 = (ulong)(byte)PVar4;
  fVar59 = *(float *)(prim + uVar50 * 0x19 + 0x12);
  auVar10 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar10 = vinsertps_avx(auVar10,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar11 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar11 = vinsertps_avx(auVar11,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar10 = vsubps_avx(auVar10,*(undefined1 (*) [16])(prim + uVar50 * 0x19 + 6));
  auVar62._0_4_ = fVar59 * auVar10._0_4_;
  auVar62._4_4_ = fVar59 * auVar10._4_4_;
  auVar62._8_4_ = fVar59 * auVar10._8_4_;
  auVar62._12_4_ = fVar59 * auVar10._12_4_;
  auVar150._0_4_ = fVar59 * auVar11._0_4_;
  auVar150._4_4_ = fVar59 * auVar11._4_4_;
  auVar150._8_4_ = fVar59 * auVar11._8_4_;
  auVar150._12_4_ = fVar59 * auVar11._12_4_;
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar50 * 4 + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar50 * 5 + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar50 * 6 + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar50 * 0xb + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar50 * 0xc + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar50 * 0xd + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar65 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar50 * 0x12 + 6)));
  auVar65 = vcvtdq2ps_avx(auVar65);
  auVar64 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar50 * 0x13 + 6)));
  auVar64 = vcvtdq2ps_avx(auVar64);
  auVar110 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar50 * 0x14 + 6)));
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar254._4_4_ = auVar150._0_4_;
  auVar254._0_4_ = auVar150._0_4_;
  auVar254._8_4_ = auVar150._0_4_;
  auVar254._12_4_ = auVar150._0_4_;
  auVar91 = vshufps_avx(auVar150,auVar150,0x55);
  auVar63 = vshufps_avx(auVar150,auVar150,0xaa);
  fVar59 = auVar63._0_4_;
  auVar234._0_4_ = fVar59 * auVar13._0_4_;
  fVar84 = auVar63._4_4_;
  auVar234._4_4_ = fVar84 * auVar13._4_4_;
  fVar86 = auVar63._8_4_;
  auVar234._8_4_ = fVar86 * auVar13._8_4_;
  fVar88 = auVar63._12_4_;
  auVar234._12_4_ = fVar88 * auVar13._12_4_;
  auVar217._0_4_ = auVar16._0_4_ * fVar59;
  auVar217._4_4_ = auVar16._4_4_ * fVar84;
  auVar217._8_4_ = auVar16._8_4_ * fVar86;
  auVar217._12_4_ = auVar16._12_4_ * fVar88;
  auVar187._0_4_ = auVar110._0_4_ * fVar59;
  auVar187._4_4_ = auVar110._4_4_ * fVar84;
  auVar187._8_4_ = auVar110._8_4_ * fVar86;
  auVar187._12_4_ = auVar110._12_4_ * fVar88;
  auVar63 = vfmadd231ps_fma(auVar234,auVar91,auVar11);
  auVar111 = vfmadd231ps_fma(auVar217,auVar91,auVar15);
  auVar91 = vfmadd231ps_fma(auVar187,auVar64,auVar91);
  auVar125 = vfmadd231ps_fma(auVar63,auVar254,auVar10);
  auVar111 = vfmadd231ps_fma(auVar111,auVar254,auVar14);
  auVar140 = vfmadd231ps_fma(auVar91,auVar65,auVar254);
  auVar158._4_4_ = auVar62._0_4_;
  auVar158._0_4_ = auVar62._0_4_;
  auVar158._8_4_ = auVar62._0_4_;
  auVar158._12_4_ = auVar62._0_4_;
  auVar91 = vshufps_avx(auVar62,auVar62,0x55);
  auVar63 = vshufps_avx(auVar62,auVar62,0xaa);
  fVar59 = auVar63._0_4_;
  auVar151._0_4_ = fVar59 * auVar13._0_4_;
  fVar84 = auVar63._4_4_;
  auVar151._4_4_ = fVar84 * auVar13._4_4_;
  fVar86 = auVar63._8_4_;
  auVar151._8_4_ = fVar86 * auVar13._8_4_;
  fVar88 = auVar63._12_4_;
  auVar151._12_4_ = fVar88 * auVar13._12_4_;
  auVar90._0_4_ = auVar16._0_4_ * fVar59;
  auVar90._4_4_ = auVar16._4_4_ * fVar84;
  auVar90._8_4_ = auVar16._8_4_ * fVar86;
  auVar90._12_4_ = auVar16._12_4_ * fVar88;
  auVar63._0_4_ = auVar110._0_4_ * fVar59;
  auVar63._4_4_ = auVar110._4_4_ * fVar84;
  auVar63._8_4_ = auVar110._8_4_ * fVar86;
  auVar63._12_4_ = auVar110._12_4_ * fVar88;
  auVar11 = vfmadd231ps_fma(auVar151,auVar91,auVar11);
  auVar13 = vfmadd231ps_fma(auVar90,auVar91,auVar15);
  auVar15 = vfmadd231ps_fma(auVar63,auVar91,auVar64);
  auVar16 = vfmadd231ps_fma(auVar11,auVar158,auVar10);
  auVar64 = vfmadd231ps_fma(auVar13,auVar158,auVar14);
  auVar110 = vfmadd231ps_fma(auVar15,auVar158,auVar65);
  local_428._8_4_ = 0x7fffffff;
  local_428._0_8_ = 0x7fffffff7fffffff;
  local_428._12_4_ = 0x7fffffff;
  auVar10 = vandps_avx(auVar125,local_428);
  auVar139._8_4_ = 0x219392ef;
  auVar139._0_8_ = 0x219392ef219392ef;
  auVar139._12_4_ = 0x219392ef;
  auVar10 = vcmpps_avx(auVar10,auVar139,1);
  auVar11 = vblendvps_avx(auVar125,auVar139,auVar10);
  auVar10 = vandps_avx(auVar111,local_428);
  auVar10 = vcmpps_avx(auVar10,auVar139,1);
  auVar13 = vblendvps_avx(auVar111,auVar139,auVar10);
  auVar10 = vandps_avx(local_428,auVar140);
  auVar10 = vcmpps_avx(auVar10,auVar139,1);
  auVar10 = vblendvps_avx(auVar140,auVar139,auVar10);
  auVar14 = vrcpps_avx(auVar11);
  auVar188._8_4_ = 0x3f800000;
  auVar188._0_8_ = 0x3f8000003f800000;
  auVar188._12_4_ = 0x3f800000;
  auVar11 = vfnmadd213ps_fma(auVar11,auVar14,auVar188);
  auVar14 = vfmadd132ps_fma(auVar11,auVar14,auVar14);
  auVar11 = vrcpps_avx(auVar13);
  auVar13 = vfnmadd213ps_fma(auVar13,auVar11,auVar188);
  auVar15 = vfmadd132ps_fma(auVar13,auVar11,auVar11);
  auVar11 = vrcpps_avx(auVar10);
  auVar13 = vfnmadd213ps_fma(auVar10,auVar11,auVar188);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar50 * 7 + 6);
  auVar10 = vpmovsxwd_avx(auVar10);
  auVar65 = vfmadd132ps_fma(auVar13,auVar11,auVar11);
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar10 = vsubps_avx(auVar10,auVar16);
  auVar140._0_4_ = auVar14._0_4_ * auVar10._0_4_;
  auVar140._4_4_ = auVar14._4_4_ * auVar10._4_4_;
  auVar140._8_4_ = auVar14._8_4_ * auVar10._8_4_;
  auVar140._12_4_ = auVar14._12_4_ * auVar10._12_4_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar50 * 9 + 6);
  auVar10 = vpmovsxwd_avx(auVar11);
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar11 = vsubps_avx(auVar10,auVar16);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar50 * 0xe + 6);
  auVar10 = vpmovsxwd_avx(auVar13);
  auVar152._0_4_ = auVar14._0_4_ * auVar11._0_4_;
  auVar152._4_4_ = auVar14._4_4_ * auVar11._4_4_;
  auVar152._8_4_ = auVar14._8_4_ * auVar11._8_4_;
  auVar152._12_4_ = auVar14._12_4_ * auVar11._12_4_;
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar10 = vsubps_avx(auVar10,auVar64);
  auVar167._0_4_ = auVar15._0_4_ * auVar10._0_4_;
  auVar167._4_4_ = auVar15._4_4_ * auVar10._4_4_;
  auVar167._8_4_ = auVar15._8_4_ * auVar10._8_4_;
  auVar167._12_4_ = auVar15._12_4_ * auVar10._12_4_;
  auVar111._1_3_ = 0;
  auVar111[0] = PVar4;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar4 * 0x10 + 6);
  auVar10 = vpmovsxwd_avx(auVar14);
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar10 = vsubps_avx(auVar10,auVar64);
  auVar91._0_4_ = auVar15._0_4_ * auVar10._0_4_;
  auVar91._4_4_ = auVar15._4_4_ * auVar10._4_4_;
  auVar91._8_4_ = auVar15._8_4_ * auVar10._8_4_;
  auVar91._12_4_ = auVar15._12_4_ * auVar10._12_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar50 * 0x15 + 6);
  auVar10 = vpmovsxwd_avx(auVar15);
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar11 = vsubps_avx(auVar10,auVar110);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar50 * 0x17 + 6);
  auVar10 = vpmovsxwd_avx(auVar16);
  auVar125._0_4_ = auVar65._0_4_ * auVar11._0_4_;
  auVar125._4_4_ = auVar65._4_4_ * auVar11._4_4_;
  auVar125._8_4_ = auVar65._8_4_ * auVar11._8_4_;
  auVar125._12_4_ = auVar65._12_4_ * auVar11._12_4_;
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar10 = vsubps_avx(auVar10,auVar110);
  auVar64._0_4_ = auVar65._0_4_ * auVar10._0_4_;
  auVar64._4_4_ = auVar65._4_4_ * auVar10._4_4_;
  auVar64._8_4_ = auVar65._8_4_ * auVar10._8_4_;
  auVar64._12_4_ = auVar65._12_4_ * auVar10._12_4_;
  auVar10 = vpminsd_avx(auVar140,auVar152);
  auVar11 = vpminsd_avx(auVar167,auVar91);
  auVar10 = vmaxps_avx(auVar10,auVar11);
  auVar11 = vpminsd_avx(auVar125,auVar64);
  uVar60 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar218._4_4_ = uVar60;
  auVar218._0_4_ = uVar60;
  auVar218._8_4_ = uVar60;
  auVar218._12_4_ = uVar60;
  auVar11 = vmaxps_avx(auVar11,auVar218);
  auVar10 = vmaxps_avx(auVar10,auVar11);
  auVar204._0_4_ = auVar10._0_4_ * 0.99999964;
  auVar204._4_4_ = auVar10._4_4_ * 0.99999964;
  auVar204._8_4_ = auVar10._8_4_ * 0.99999964;
  auVar204._12_4_ = auVar10._12_4_ * 0.99999964;
  auVar10 = vpmaxsd_avx(auVar140,auVar152);
  auVar11 = vpmaxsd_avx(auVar167,auVar91);
  auVar10 = vminps_avx(auVar10,auVar11);
  auVar11 = vpmaxsd_avx(auVar125,auVar64);
  uVar60 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar110._4_4_ = uVar60;
  auVar110._0_4_ = uVar60;
  auVar110._8_4_ = uVar60;
  auVar110._12_4_ = uVar60;
  auVar11 = vminps_avx(auVar11,auVar110);
  auVar10 = vminps_avx(auVar10,auVar11);
  auVar111[4] = PVar4;
  auVar111._5_3_ = 0;
  auVar111[8] = PVar4;
  auVar111._9_3_ = 0;
  auVar111[0xc] = PVar4;
  auVar111._13_3_ = 0;
  auVar11 = vpcmpgtd_avx(auVar111,_DAT_01f4ad30);
  auVar65._0_4_ = auVar10._0_4_ * 1.0000004;
  auVar65._4_4_ = auVar10._4_4_ * 1.0000004;
  auVar65._8_4_ = auVar10._8_4_ * 1.0000004;
  auVar65._12_4_ = auVar10._12_4_ * 1.0000004;
  auVar10 = vcmpps_avx(auVar204,auVar65,2);
  auVar10 = vandps_avx(auVar10,auVar11);
  uVar54 = vmovmskps_avx(auVar10);
  auVar81._16_16_ = mm_lookupmask_ps._240_16_;
  auVar81._0_16_ = mm_lookupmask_ps._240_16_;
  local_518 = pre->ray_space + k;
  local_1b8 = vblendps_avx(auVar81,ZEXT832(0) << 0x20,0x80);
  local_520 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
LAB_01133810:
  pLVar48 = local_518;
  local_510 = (ulong)uVar54;
  if (local_510 == 0) {
LAB_0113547a:
    return local_510 != 0;
  }
  lVar51 = 0;
  for (uVar50 = local_510; (uVar50 & 1) == 0; uVar50 = uVar50 >> 1 | 0x8000000000000000) {
    lVar51 = lVar51 + 1;
  }
  uVar54 = *(uint *)(prim + 2);
  uVar5 = *(uint *)(prim + lVar51 * 4 + 6);
  pGVar6 = (context->scene->geometries).items[uVar54].ptr;
  uVar50 = (ulong)*(uint *)(*(long *)&pGVar6->field_0x58 +
                           pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar5);
  p_Var7 = pGVar6[1].intersectionFilterN;
  pvVar8 = pGVar6[2].userPtr;
  _Var9 = pGVar6[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar16 = *(undefined1 (*) [16])(_Var9 + uVar50 * (long)pvVar8);
  auVar10 = *(undefined1 (*) [16])(_Var9 + (uVar50 + 1) * (long)pvVar8);
  auVar11 = *(undefined1 (*) [16])(_Var9 + (uVar50 + 2) * (long)pvVar8);
  pfVar1 = (float *)(_Var9 + (long)pvVar8 * (uVar50 + 3));
  fVar59 = *pfVar1;
  fVar84 = pfVar1[1];
  fVar86 = pfVar1[2];
  fVar88 = pfVar1[3];
  lVar51 = *(long *)&pGVar6[1].time_range.upper;
  auVar13 = *(undefined1 (*) [16])(lVar51 + (long)p_Var7 * uVar50);
  auVar14 = *(undefined1 (*) [16])(lVar51 + (long)p_Var7 * (uVar50 + 1));
  auVar15 = *(undefined1 (*) [16])(lVar51 + (long)p_Var7 * (uVar50 + 2));
  uVar57 = local_510 - 1 & local_510;
  pfVar1 = (float *)(lVar51 + (long)p_Var7 * (uVar50 + 3));
  fVar166 = *pfVar1;
  fVar184 = pfVar1[1];
  fVar185 = pfVar1[2];
  fVar186 = pfVar1[3];
  if (uVar57 != 0) {
    uVar55 = uVar57 - 1 & uVar57;
    for (uVar50 = uVar57; (uVar50 & 1) == 0; uVar50 = uVar50 >> 1 | 0x8000000000000000) {
    }
    if (uVar55 != 0) {
      for (; (uVar55 & 1) == 0; uVar55 = uVar55 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar65 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar65 = vinsertps_avx(auVar65,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  auVar128._0_4_ = fVar166 * 0.0;
  auVar128._4_4_ = fVar184 * 0.0;
  auVar128._8_4_ = fVar185 * 0.0;
  auVar128._12_4_ = fVar186 * 0.0;
  auVar274._8_4_ = 0x3e2aaaab;
  auVar274._0_8_ = 0x3e2aaaab3e2aaaab;
  auVar274._12_4_ = 0x3e2aaaab;
  auVar64 = vfmadd213ps_fma(auVar274,auVar15,auVar128);
  auVar205._8_4_ = 0x3f2aaaab;
  auVar205._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar205._12_4_ = 0x3f2aaaab;
  auVar64 = vfmadd231ps_fma(auVar64,auVar14,auVar205);
  auVar110 = vfmadd231ps_fma(auVar64,auVar13,auVar274);
  auVar66._8_4_ = 0x3f000000;
  auVar66._0_8_ = 0x3f0000003f000000;
  auVar66._12_4_ = 0x3f000000;
  auVar64 = vfmadd231ps_fma(auVar128,auVar15,auVar66);
  auVar64 = vfnmadd231ps_fma(auVar64,auVar14,ZEXT816(0) << 0x40);
  auVar63 = vfnmadd231ps_fma(auVar64,auVar13,auVar66);
  auVar251._0_4_ = fVar59 * 0.0;
  auVar251._4_4_ = fVar84 * 0.0;
  auVar251._8_4_ = fVar86 * 0.0;
  auVar251._12_4_ = fVar88 * 0.0;
  auVar140 = ZEXT816(0) << 0x40;
  auVar64 = vfmadd213ps_fma(auVar274,auVar11,auVar251);
  auVar64 = vfmadd231ps_fma(auVar64,auVar10,auVar205);
  auVar64 = vfmadd231ps_fma(auVar64,auVar16,auVar274);
  auVar91 = vfmadd231ps_fma(auVar251,auVar11,auVar66);
  auVar91 = vfnmadd231ps_fma(auVar91,auVar10,auVar140);
  auVar111 = vfnmadd231ps_fma(auVar91,auVar16,auVar66);
  auVar126._0_4_ = fVar166 * 0.16666667;
  auVar126._4_4_ = fVar184 * 0.16666667;
  auVar126._8_4_ = fVar185 * 0.16666667;
  auVar126._12_4_ = fVar186 * 0.16666667;
  auVar91 = vfmadd231ps_fma(auVar126,auVar15,auVar205);
  auVar91 = vfmadd231ps_fma(auVar91,auVar14,auVar274);
  auVar91 = vfmadd231ps_fma(auVar91,auVar13,auVar140);
  auVar141._0_4_ = fVar166 * 0.5;
  auVar141._4_4_ = fVar184 * 0.5;
  auVar141._8_4_ = fVar185 * 0.5;
  auVar141._12_4_ = fVar186 * 0.5;
  auVar15 = vfmadd231ps_fma(auVar141,auVar140,auVar15);
  auVar14 = vfnmadd231ps_fma(auVar15,auVar66,auVar14);
  auVar125 = vfnmadd231ps_fma(auVar14,auVar140,auVar13);
  auVar219._0_4_ = fVar59 * 0.16666667;
  auVar219._4_4_ = fVar84 * 0.16666667;
  auVar219._8_4_ = fVar86 * 0.16666667;
  auVar219._12_4_ = fVar88 * 0.16666667;
  auVar112._8_4_ = 0x3f2aaaab;
  auVar112._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar112._12_4_ = 0x3f2aaaab;
  auVar13 = vfmadd231ps_fma(auVar219,auVar11,auVar112);
  auVar13 = vfmadd231ps_fma(auVar13,auVar10,auVar274);
  auVar15 = vfmadd231ps_fma(auVar13,auVar16,auVar140);
  auVar235._0_4_ = fVar59 * 0.5;
  auVar235._4_4_ = fVar84 * 0.5;
  auVar235._8_4_ = fVar86 * 0.5;
  auVar235._12_4_ = fVar88 * 0.5;
  auVar11 = vfmadd231ps_fma(auVar235,auVar140,auVar11);
  auVar10 = vfnmadd231ps_fma(auVar11,auVar66,auVar10);
  auVar16 = vfnmadd231ps_fma(auVar10,auVar140,auVar16);
  auVar10 = vshufps_avx(auVar63,auVar63,0xc9);
  auVar11 = vshufps_avx(auVar64,auVar64,0xc9);
  fVar124 = auVar63._0_4_;
  auVar168._0_4_ = fVar124 * auVar11._0_4_;
  fVar85 = auVar63._4_4_;
  auVar168._4_4_ = fVar85 * auVar11._4_4_;
  fVar87 = auVar63._8_4_;
  auVar168._8_4_ = fVar87 * auVar11._8_4_;
  fVar149 = auVar63._12_4_;
  auVar168._12_4_ = fVar149 * auVar11._12_4_;
  auVar11 = vfmsub231ps_fma(auVar168,auVar10,auVar64);
  auVar13 = vshufps_avx(auVar11,auVar11,0xc9);
  auVar11 = vshufps_avx(auVar111,auVar111,0xc9);
  auVar169._0_4_ = fVar124 * auVar11._0_4_;
  auVar169._4_4_ = fVar85 * auVar11._4_4_;
  auVar169._8_4_ = fVar87 * auVar11._8_4_;
  auVar169._12_4_ = fVar149 * auVar11._12_4_;
  auVar10 = vfmsub231ps_fma(auVar169,auVar10,auVar111);
  auVar14 = vshufps_avx(auVar10,auVar10,0xc9);
  auVar11 = vshufps_avx(auVar125,auVar125,0xc9);
  auVar10 = vshufps_avx(auVar15,auVar15,0xc9);
  fVar61 = auVar125._0_4_;
  auVar153._0_4_ = fVar61 * auVar10._0_4_;
  fVar233 = auVar125._4_4_;
  auVar153._4_4_ = fVar233 * auVar10._4_4_;
  fVar137 = auVar125._8_4_;
  auVar153._8_4_ = fVar137 * auVar10._8_4_;
  fVar138 = auVar125._12_4_;
  auVar153._12_4_ = fVar138 * auVar10._12_4_;
  auVar10 = vfmsub231ps_fma(auVar153,auVar11,auVar15);
  auVar15 = vshufps_avx(auVar10,auVar10,0xc9);
  auVar10 = vshufps_avx(auVar16,auVar16,0xc9);
  auVar189._0_4_ = fVar61 * auVar10._0_4_;
  auVar189._4_4_ = fVar233 * auVar10._4_4_;
  auVar189._8_4_ = fVar137 * auVar10._8_4_;
  auVar189._12_4_ = fVar138 * auVar10._12_4_;
  auVar10 = vdpps_avx(auVar13,auVar13,0x7f);
  auVar11 = vfmsub231ps_fma(auVar189,auVar11,auVar16);
  auVar16 = vshufps_avx(auVar11,auVar11,0xc9);
  fVar84 = auVar10._0_4_;
  auVar64 = ZEXT416((uint)fVar84);
  auVar11 = vrsqrtss_avx(auVar64,auVar64);
  fVar59 = auVar11._0_4_;
  fVar59 = fVar59 * 1.5 + fVar84 * -0.5 * fVar59 * fVar59 * fVar59;
  fVar166 = auVar13._0_4_ * fVar59;
  fVar184 = auVar13._4_4_ * fVar59;
  fVar185 = auVar13._8_4_ * fVar59;
  fVar186 = auVar13._12_4_ * fVar59;
  auVar11 = vdpps_avx(auVar13,auVar14,0x7f);
  auVar245._0_4_ = auVar14._0_4_ * fVar84;
  auVar245._4_4_ = auVar14._4_4_ * fVar84;
  auVar245._8_4_ = auVar14._8_4_ * fVar84;
  auVar245._12_4_ = auVar14._12_4_ * fVar84;
  fVar84 = auVar11._0_4_;
  auVar206._0_4_ = auVar13._0_4_ * fVar84;
  auVar206._4_4_ = auVar13._4_4_ * fVar84;
  auVar206._8_4_ = auVar13._8_4_ * fVar84;
  auVar206._12_4_ = auVar13._12_4_ * fVar84;
  auVar13 = vsubps_avx(auVar245,auVar206);
  auVar11 = vrcpss_avx(auVar64,auVar64);
  auVar10 = vfnmadd213ss_fma(auVar10,auVar11,SUB6416(ZEXT464(0x40000000),0));
  fVar86 = auVar11._0_4_ * auVar10._0_4_;
  auVar10 = vdpps_avx(auVar15,auVar15,0x7f);
  fVar88 = auVar10._0_4_;
  auVar64 = ZEXT416((uint)fVar88);
  auVar11 = vrsqrtss_avx(auVar64,auVar64);
  fVar84 = auVar11._0_4_;
  fVar84 = fVar84 * 1.5 + fVar88 * -0.5 * fVar84 * fVar84 * fVar84;
  auVar11 = vdpps_avx(auVar15,auVar16,0x7f);
  fVar262 = fVar84 * auVar15._0_4_;
  fVar271 = fVar84 * auVar15._4_4_;
  fVar272 = fVar84 * auVar15._8_4_;
  fVar273 = fVar84 * auVar15._12_4_;
  auVar190._0_4_ = fVar88 * auVar16._0_4_;
  auVar190._4_4_ = fVar88 * auVar16._4_4_;
  auVar190._8_4_ = fVar88 * auVar16._8_4_;
  auVar190._12_4_ = fVar88 * auVar16._12_4_;
  fVar88 = auVar11._0_4_;
  auVar154._0_4_ = fVar88 * auVar15._0_4_;
  auVar154._4_4_ = fVar88 * auVar15._4_4_;
  auVar154._8_4_ = fVar88 * auVar15._8_4_;
  auVar154._12_4_ = fVar88 * auVar15._12_4_;
  auVar14 = vsubps_avx(auVar190,auVar154);
  auVar11 = vrcpss_avx(auVar64,auVar64);
  auVar10 = vfnmadd213ss_fma(auVar10,auVar11,ZEXT416(0x40000000));
  fVar88 = auVar10._0_4_ * auVar11._0_4_;
  auVar10 = vshufps_avx(auVar110,auVar110,0xff);
  auVar220._0_4_ = auVar10._0_4_ * fVar166;
  auVar220._4_4_ = auVar10._4_4_ * fVar184;
  auVar220._8_4_ = auVar10._8_4_ * fVar185;
  auVar220._12_4_ = auVar10._12_4_ * fVar186;
  local_468 = vsubps_avx(auVar110,auVar220);
  auVar11 = vshufps_avx(auVar63,auVar63,0xff);
  auVar170._0_4_ = auVar11._0_4_ * fVar166 + fVar59 * auVar13._0_4_ * fVar86 * auVar10._0_4_;
  auVar170._4_4_ = auVar11._4_4_ * fVar184 + fVar59 * auVar13._4_4_ * fVar86 * auVar10._4_4_;
  auVar170._8_4_ = auVar11._8_4_ * fVar185 + fVar59 * auVar13._8_4_ * fVar86 * auVar10._8_4_;
  auVar170._12_4_ = auVar11._12_4_ * fVar186 + fVar59 * auVar13._12_4_ * fVar86 * auVar10._12_4_;
  auVar13 = vsubps_avx(auVar63,auVar170);
  local_478._0_4_ = auVar110._0_4_ + auVar220._0_4_;
  local_478._4_4_ = auVar110._4_4_ + auVar220._4_4_;
  fStack_470 = auVar110._8_4_ + auVar220._8_4_;
  fStack_46c = auVar110._12_4_ + auVar220._12_4_;
  auVar10 = vshufps_avx(auVar91,auVar91,0xff);
  auVar113._0_4_ = fVar262 * auVar10._0_4_;
  auVar113._4_4_ = fVar271 * auVar10._4_4_;
  auVar113._8_4_ = fVar272 * auVar10._8_4_;
  auVar113._12_4_ = fVar273 * auVar10._12_4_;
  local_488 = vsubps_avx(auVar91,auVar113);
  auVar11 = vshufps_avx(auVar125,auVar125,0xff);
  auVar92._0_4_ = fVar262 * auVar11._0_4_ + auVar10._0_4_ * fVar84 * auVar14._0_4_ * fVar88;
  auVar92._4_4_ = fVar271 * auVar11._4_4_ + auVar10._4_4_ * fVar84 * auVar14._4_4_ * fVar88;
  auVar92._8_4_ = fVar272 * auVar11._8_4_ + auVar10._8_4_ * fVar84 * auVar14._8_4_ * fVar88;
  auVar92._12_4_ = fVar273 * auVar11._12_4_ + auVar10._12_4_ * fVar84 * auVar14._12_4_ * fVar88;
  auVar10 = vsubps_avx(auVar125,auVar92);
  fVar166 = auVar91._0_4_ + auVar113._0_4_;
  fVar184 = auVar91._4_4_ + auVar113._4_4_;
  fVar185 = auVar91._8_4_ + auVar113._8_4_;
  fVar186 = auVar91._12_4_ + auVar113._12_4_;
  local_498._0_4_ = local_468._0_4_ + auVar13._0_4_ * 0.33333334;
  local_498._4_4_ = local_468._4_4_ + auVar13._4_4_ * 0.33333334;
  local_498._8_4_ = local_468._8_4_ + auVar13._8_4_ * 0.33333334;
  local_498._12_4_ = local_468._12_4_ + auVar13._12_4_ * 0.33333334;
  auVar93._0_4_ = auVar10._0_4_ * 0.33333334;
  auVar93._4_4_ = auVar10._4_4_ * 0.33333334;
  auVar93._8_4_ = auVar10._8_4_ * 0.33333334;
  auVar93._12_4_ = auVar10._12_4_ * 0.33333334;
  local_4a8 = vsubps_avx(local_488,auVar93);
  local_448 = vsubps_avx(local_468,auVar65);
  auVar10 = vshufps_avx(local_448,local_448,0x55);
  auVar11 = vshufps_avx(local_448,local_448,0xaa);
  aVar3 = (local_518->vy).field_0;
  fVar59 = (local_518->vz).field_0.m128[0];
  fVar84 = *(float *)((long)&(local_518->vz).field_0 + 4);
  fVar86 = *(float *)((long)&(local_518->vz).field_0 + 8);
  fVar88 = *(float *)((long)&(local_518->vz).field_0 + 0xc);
  auVar94._0_4_ = fVar59 * auVar11._0_4_;
  auVar94._4_4_ = fVar84 * auVar11._4_4_;
  auVar94._8_4_ = fVar86 * auVar11._8_4_;
  auVar94._12_4_ = fVar88 * auVar11._12_4_;
  auVar13 = vfmadd231ps_fma(auVar94,(undefined1  [16])aVar3,auVar10);
  local_458 = vsubps_avx(local_498,auVar65);
  auVar10 = vshufps_avx(local_458,local_458,0x55);
  auVar11 = vshufps_avx(local_458,local_458,0xaa);
  auVar280._0_4_ = fVar59 * auVar11._0_4_;
  auVar280._4_4_ = fVar84 * auVar11._4_4_;
  auVar280._8_4_ = fVar86 * auVar11._8_4_;
  auVar280._12_4_ = fVar88 * auVar11._12_4_;
  auVar11 = vfmadd231ps_fma(auVar280,(undefined1  [16])aVar3,auVar10);
  auVar64 = vsubps_avx(local_4a8,auVar65);
  auVar10 = vshufps_avx(auVar64,auVar64,0xaa);
  auVar252._0_4_ = fVar59 * auVar10._0_4_;
  auVar252._4_4_ = fVar84 * auVar10._4_4_;
  auVar252._8_4_ = fVar86 * auVar10._8_4_;
  auVar252._12_4_ = fVar88 * auVar10._12_4_;
  auVar10 = vshufps_avx(auVar64,auVar64,0x55);
  auVar14 = vfmadd231ps_fma(auVar252,(undefined1  [16])aVar3,auVar10);
  auVar110 = vsubps_avx(local_488,auVar65);
  auVar10 = vshufps_avx(auVar110,auVar110,0xaa);
  auVar263._0_4_ = fVar59 * auVar10._0_4_;
  auVar263._4_4_ = fVar84 * auVar10._4_4_;
  auVar263._8_4_ = fVar86 * auVar10._8_4_;
  auVar263._12_4_ = fVar88 * auVar10._12_4_;
  auVar10 = vshufps_avx(auVar110,auVar110,0x55);
  auVar15 = vfmadd231ps_fma(auVar263,(undefined1  [16])aVar3,auVar10);
  auVar91 = vsubps_avx(_local_478,auVar65);
  auVar10 = vshufps_avx(auVar91,auVar91,0xaa);
  auVar155._0_4_ = fVar59 * auVar10._0_4_;
  auVar155._4_4_ = fVar84 * auVar10._4_4_;
  auVar155._8_4_ = fVar86 * auVar10._8_4_;
  auVar155._12_4_ = fVar88 * auVar10._12_4_;
  auVar10 = vshufps_avx(auVar91,auVar91,0x55);
  auVar16 = vfmadd231ps_fma(auVar155,(undefined1  [16])aVar3,auVar10);
  local_4b8._0_4_ = (fVar124 + auVar170._0_4_) * 0.33333334 + (float)local_478._0_4_;
  local_4b8._4_4_ = (fVar85 + auVar170._4_4_) * 0.33333334 + (float)local_478._4_4_;
  fStack_4b0 = (fVar87 + auVar170._8_4_) * 0.33333334 + fStack_470;
  fStack_4ac = (fVar149 + auVar170._12_4_) * 0.33333334 + fStack_46c;
  auVar63 = vsubps_avx(_local_4b8,auVar65);
  auVar10 = vshufps_avx(auVar63,auVar63,0xaa);
  auVar207._0_4_ = auVar10._0_4_ * fVar59;
  auVar207._4_4_ = auVar10._4_4_ * fVar84;
  auVar207._8_4_ = auVar10._8_4_ * fVar86;
  auVar207._12_4_ = auVar10._12_4_ * fVar88;
  auVar10 = vshufps_avx(auVar63,auVar63,0x55);
  auVar140 = vfmadd231ps_fma(auVar207,(undefined1  [16])aVar3,auVar10);
  auVar221._0_4_ = (fVar61 + auVar92._0_4_) * 0.33333334;
  auVar221._4_4_ = (fVar233 + auVar92._4_4_) * 0.33333334;
  auVar221._8_4_ = (fVar137 + auVar92._8_4_) * 0.33333334;
  auVar221._12_4_ = (fVar138 + auVar92._12_4_) * 0.33333334;
  auVar131._4_4_ = fVar184;
  auVar131._0_4_ = fVar166;
  auVar131._8_4_ = fVar185;
  auVar131._12_4_ = fVar186;
  _local_4c8 = vsubps_avx(auVar131,auVar221);
  auVar111 = vsubps_avx(_local_4c8,auVar65);
  auVar10 = vshufps_avx(auVar111,auVar111,0xaa);
  auVar222._0_4_ = auVar10._0_4_ * fVar59;
  auVar222._4_4_ = auVar10._4_4_ * fVar84;
  auVar222._8_4_ = auVar10._8_4_ * fVar86;
  auVar222._12_4_ = auVar10._12_4_ * fVar88;
  auVar10 = vshufps_avx(auVar111,auVar111,0x55);
  auVar62 = vfmadd231ps_fma(auVar222,(undefined1  [16])aVar3,auVar10);
  auVar125 = vsubps_avx(auVar131,auVar65);
  auVar10 = vshufps_avx(auVar125,auVar125,0xaa);
  auVar67._0_4_ = fVar59 * auVar10._0_4_;
  auVar67._4_4_ = fVar84 * auVar10._4_4_;
  auVar67._8_4_ = fVar86 * auVar10._8_4_;
  auVar67._12_4_ = fVar88 * auVar10._12_4_;
  auVar10 = vshufps_avx(auVar125,auVar125,0x55);
  auVar10 = vfmadd231ps_fma(auVar67,(undefined1  [16])aVar3,auVar10);
  auVar171._4_4_ = local_448._0_4_;
  auVar171._0_4_ = local_448._0_4_;
  auVar171._8_4_ = local_448._0_4_;
  auVar171._12_4_ = local_448._0_4_;
  aVar3 = (local_518->vx).field_0;
  auVar90 = vfmadd231ps_fma(auVar13,(undefined1  [16])aVar3,auVar171);
  auVar172._4_4_ = local_458._0_4_;
  auVar172._0_4_ = local_458._0_4_;
  auVar172._8_4_ = local_458._0_4_;
  auVar172._12_4_ = local_458._0_4_;
  auVar139 = vfmadd231ps_fma(auVar11,(undefined1  [16])aVar3,auVar172);
  uVar60 = auVar64._0_4_;
  auVar173._4_4_ = uVar60;
  auVar173._0_4_ = uVar60;
  auVar173._8_4_ = uVar60;
  auVar173._12_4_ = uVar60;
  auVar150 = vfmadd231ps_fma(auVar14,(undefined1  [16])aVar3,auVar173);
  uVar60 = auVar110._0_4_;
  auVar174._4_4_ = uVar60;
  auVar174._0_4_ = uVar60;
  auVar174._8_4_ = uVar60;
  auVar174._12_4_ = uVar60;
  auVar151 = vfmadd231ps_fma(auVar15,(undefined1  [16])aVar3,auVar174);
  uVar60 = auVar91._0_4_;
  auVar175._4_4_ = uVar60;
  auVar175._0_4_ = uVar60;
  auVar175._8_4_ = uVar60;
  auVar175._12_4_ = uVar60;
  auVar152 = vfmadd231ps_fma(auVar16,(undefined1  [16])aVar3,auVar175);
  uVar60 = auVar63._0_4_;
  auVar176._4_4_ = uVar60;
  auVar176._0_4_ = uVar60;
  auVar176._8_4_ = uVar60;
  auVar176._12_4_ = uVar60;
  auVar167 = vfmadd231ps_fma(auVar140,(undefined1  [16])aVar3,auVar176);
  uVar60 = auVar111._0_4_;
  auVar177._4_4_ = uVar60;
  auVar177._0_4_ = uVar60;
  auVar177._8_4_ = uVar60;
  auVar177._12_4_ = uVar60;
  auVar187 = vfmadd231ps_fma(auVar62,(undefined1  [16])aVar3,auVar177);
  uVar60 = auVar125._0_4_;
  auVar178._4_4_ = uVar60;
  auVar178._0_4_ = uVar60;
  auVar178._8_4_ = uVar60;
  auVar178._12_4_ = uVar60;
  auVar188 = vfmadd231ps_fma(auVar10,(undefined1  [16])aVar3,auVar178);
  auVar14 = vmovlhps_avx(auVar90,auVar152);
  auVar15 = vmovlhps_avx(auVar139,auVar167);
  auVar16 = vmovlhps_avx(auVar150,auVar187);
  auVar65 = vmovlhps_avx(auVar151,auVar188);
  auVar10 = vminps_avx(auVar14,auVar15);
  auVar11 = vminps_avx(auVar16,auVar65);
  auVar13 = vminps_avx(auVar10,auVar11);
  auVar10 = vmaxps_avx(auVar14,auVar15);
  auVar11 = vmaxps_avx(auVar16,auVar65);
  auVar10 = vmaxps_avx(auVar10,auVar11);
  auVar11 = vshufpd_avx(auVar13,auVar13,3);
  auVar13 = vminps_avx(auVar13,auVar11);
  auVar11 = vshufpd_avx(auVar10,auVar10,3);
  auVar11 = vmaxps_avx(auVar10,auVar11);
  auVar10 = vandps_avx(local_428,auVar13);
  auVar11 = vandps_avx(local_428,auVar11);
  auVar10 = vmaxps_avx(auVar10,auVar11);
  auVar11 = vmovshdup_avx(auVar10);
  auVar10 = vmaxss_avx(auVar11,auVar10);
  fVar84 = auVar10._0_4_ * 9.536743e-07;
  auVar191._8_8_ = auVar90._0_8_;
  auVar191._0_8_ = auVar90._0_8_;
  auVar236._8_8_ = auVar139._0_8_;
  auVar236._0_8_ = auVar139._0_8_;
  auVar253._0_8_ = auVar150._0_8_;
  auVar253._8_8_ = auVar253._0_8_;
  auVar264._0_8_ = auVar151._0_8_;
  auVar264._8_8_ = auVar264._0_8_;
  local_438 = 0x80000000;
  uStack_434 = 0x80000000;
  uStack_430 = 0x80000000;
  uStack_42c = 0x80000000;
  local_78 = fVar84;
  fStack_74 = fVar84;
  fStack_70 = fVar84;
  fStack_6c = fVar84;
  fStack_68 = fVar84;
  fStack_64 = fVar84;
  fStack_60 = fVar84;
  fStack_5c = fVar84;
  fStack_90 = -fVar84;
  local_98 = -fVar84;
  fStack_94 = -fVar84;
  fStack_8c = fStack_90;
  fStack_88 = fStack_90;
  fStack_84 = fStack_90;
  fStack_80 = fStack_90;
  fStack_7c = fStack_90;
  bVar56 = false;
  uVar50 = 0;
  fVar59 = *(float *)(ray + k * 4 + 0x30);
  auVar11 = vsubps_avx(auVar15,auVar14);
  auVar13 = vsubps_avx(auVar16,auVar15);
  auVar140 = vsubps_avx(auVar65,auVar16);
  auVar62 = vsubps_avx(_local_478,local_468);
  auVar90 = vsubps_avx(_local_4b8,local_498);
  auVar139 = vsubps_avx(_local_4c8,local_4a8);
  auVar246._4_4_ = fVar184;
  auVar246._0_4_ = fVar166;
  auVar246._8_4_ = fVar185;
  auVar246._12_4_ = fVar186;
  auVar150 = vsubps_avx(auVar246,local_488);
  auVar68 = ZEXT816(0x3f80000000000000);
  auVar10 = auVar68;
LAB_01134019:
  auVar151 = vshufps_avx(auVar68,auVar68,0x50);
  auVar281._8_4_ = 0x3f800000;
  auVar281._0_8_ = 0x3f8000003f800000;
  auVar281._12_4_ = 0x3f800000;
  auVar284._16_4_ = 0x3f800000;
  auVar284._0_16_ = auVar281;
  auVar284._20_4_ = 0x3f800000;
  auVar284._24_4_ = 0x3f800000;
  auVar284._28_4_ = 0x3f800000;
  auVar217 = vsubps_avx(auVar281,auVar151);
  fVar86 = auVar151._0_4_;
  fVar138 = auVar152._0_4_;
  auVar69._0_4_ = fVar138 * fVar86;
  fVar88 = auVar151._4_4_;
  fVar262 = auVar152._4_4_;
  auVar69._4_4_ = fVar262 * fVar88;
  fVar124 = auVar151._8_4_;
  auVar69._8_4_ = fVar138 * fVar124;
  fVar85 = auVar151._12_4_;
  auVar69._12_4_ = fVar262 * fVar85;
  fVar271 = auVar167._0_4_;
  auVar179._0_4_ = fVar271 * fVar86;
  fVar272 = auVar167._4_4_;
  auVar179._4_4_ = fVar272 * fVar88;
  auVar179._8_4_ = fVar271 * fVar124;
  auVar179._12_4_ = fVar272 * fVar85;
  fVar203 = auVar187._0_4_;
  auVar142._0_4_ = fVar203 * fVar86;
  fVar215 = auVar187._4_4_;
  auVar142._4_4_ = fVar215 * fVar88;
  auVar142._8_4_ = fVar203 * fVar124;
  auVar142._12_4_ = fVar215 * fVar85;
  fVar216 = auVar188._0_4_;
  auVar114._0_4_ = fVar216 * fVar86;
  fVar232 = auVar188._4_4_;
  auVar114._4_4_ = fVar232 * fVar88;
  auVar114._8_4_ = fVar216 * fVar124;
  auVar114._12_4_ = fVar232 * fVar85;
  auVar254 = vfmadd231ps_fma(auVar69,auVar217,auVar191);
  auVar158 = vfmadd231ps_fma(auVar179,auVar217,auVar236);
  auVar131 = vfmadd231ps_fma(auVar142,auVar217,auVar253);
  auVar246 = vfmadd231ps_fma(auVar114,auVar264,auVar217);
  auVar151 = vmovshdup_avx(auVar10);
  fVar86 = auVar10._0_4_;
  fStack_140 = (auVar151._0_4_ - fVar86) * 0.04761905;
  auVar230._4_4_ = fVar86;
  auVar230._0_4_ = fVar86;
  auVar230._8_4_ = fVar86;
  auVar230._12_4_ = fVar86;
  auVar230._16_4_ = fVar86;
  auVar230._20_4_ = fVar86;
  auVar230._24_4_ = fVar86;
  auVar230._28_4_ = fVar86;
  auVar106._0_8_ = auVar151._0_8_;
  auVar106._8_8_ = auVar106._0_8_;
  auVar106._16_8_ = auVar106._0_8_;
  auVar106._24_8_ = auVar106._0_8_;
  auVar81 = vsubps_avx(auVar106,auVar230);
  uVar60 = auVar254._0_4_;
  auVar278._4_4_ = uVar60;
  auVar278._0_4_ = uVar60;
  auVar278._8_4_ = uVar60;
  auVar278._12_4_ = uVar60;
  auVar278._16_4_ = uVar60;
  auVar278._20_4_ = uVar60;
  auVar278._24_4_ = uVar60;
  auVar278._28_4_ = uVar60;
  auVar151 = vmovshdup_avx(auVar254);
  uVar89 = auVar151._0_8_;
  auVar270._8_8_ = uVar89;
  auVar270._0_8_ = uVar89;
  auVar270._16_8_ = uVar89;
  auVar270._24_8_ = uVar89;
  fVar137 = auVar158._0_4_;
  auVar259._4_4_ = fVar137;
  auVar259._0_4_ = fVar137;
  auVar259._8_4_ = fVar137;
  auVar259._12_4_ = fVar137;
  auVar259._16_4_ = fVar137;
  auVar259._20_4_ = fVar137;
  auVar259._24_4_ = fVar137;
  auVar259._28_4_ = fVar137;
  auVar217 = vmovshdup_avx(auVar158);
  auVar107._0_8_ = auVar217._0_8_;
  auVar107._8_8_ = auVar107._0_8_;
  auVar107._16_8_ = auVar107._0_8_;
  auVar107._24_8_ = auVar107._0_8_;
  fVar233 = auVar131._0_4_;
  auVar194._4_4_ = fVar233;
  auVar194._0_4_ = fVar233;
  auVar194._8_4_ = fVar233;
  auVar194._12_4_ = fVar233;
  auVar194._16_4_ = fVar233;
  auVar194._20_4_ = fVar233;
  auVar194._24_4_ = fVar233;
  auVar194._28_4_ = fVar233;
  auVar218 = vmovshdup_avx(auVar131);
  auVar213._0_8_ = auVar218._0_8_;
  auVar213._8_8_ = auVar213._0_8_;
  auVar213._16_8_ = auVar213._0_8_;
  auVar213._24_8_ = auVar213._0_8_;
  fVar61 = auVar246._0_4_;
  auVar234 = vmovshdup_avx(auVar246);
  auVar66 = vfmadd132ps_fma(auVar81,auVar230,_DAT_01f7b040);
  auVar81 = vsubps_avx(auVar284,ZEXT1632(auVar66));
  fVar86 = auVar66._0_4_;
  fVar88 = auVar66._4_4_;
  auVar17._4_4_ = fVar137 * fVar88;
  auVar17._0_4_ = fVar137 * fVar86;
  fVar124 = auVar66._8_4_;
  auVar17._8_4_ = fVar137 * fVar124;
  fVar85 = auVar66._12_4_;
  auVar17._12_4_ = fVar137 * fVar85;
  auVar17._16_4_ = fVar137 * 0.0;
  auVar17._20_4_ = fVar137 * 0.0;
  auVar17._24_4_ = fVar137 * 0.0;
  auVar17._28_4_ = 0x3f800000;
  auVar66 = vfmadd231ps_fma(auVar17,auVar81,auVar278);
  fVar87 = auVar217._0_4_;
  fVar149 = auVar217._4_4_;
  auVar18._4_4_ = fVar149 * fVar88;
  auVar18._0_4_ = fVar87 * fVar86;
  auVar18._8_4_ = fVar87 * fVar124;
  auVar18._12_4_ = fVar149 * fVar85;
  auVar18._16_4_ = fVar87 * 0.0;
  auVar18._20_4_ = fVar149 * 0.0;
  auVar18._24_4_ = fVar87 * 0.0;
  auVar18._28_4_ = uVar60;
  auVar67 = vfmadd231ps_fma(auVar18,auVar81,auVar270);
  auVar19._4_4_ = fVar233 * fVar88;
  auVar19._0_4_ = fVar233 * fVar86;
  auVar19._8_4_ = fVar233 * fVar124;
  auVar19._12_4_ = fVar233 * fVar85;
  auVar19._16_4_ = fVar233 * 0.0;
  auVar19._20_4_ = fVar233 * 0.0;
  auVar19._24_4_ = fVar233 * 0.0;
  auVar19._28_4_ = auVar151._4_4_;
  auVar128 = vfmadd231ps_fma(auVar19,auVar81,auVar259);
  fVar87 = auVar218._0_4_;
  fVar149 = auVar218._4_4_;
  auVar12._4_4_ = fVar149 * fVar88;
  auVar12._0_4_ = fVar87 * fVar86;
  auVar12._8_4_ = fVar87 * fVar124;
  auVar12._12_4_ = fVar149 * fVar85;
  auVar12._16_4_ = fVar87 * 0.0;
  auVar12._20_4_ = fVar149 * 0.0;
  auVar12._24_4_ = fVar87 * 0.0;
  auVar12._28_4_ = fVar137;
  auVar92 = vfmadd231ps_fma(auVar12,auVar81,auVar107);
  auVar151 = vshufps_avx(auVar254,auVar254,0xaa);
  local_578._8_8_ = auVar151._0_8_;
  local_578._0_8_ = local_578._8_8_;
  local_578._16_8_ = local_578._8_8_;
  local_578._24_8_ = local_578._8_8_;
  auVar217 = vshufps_avx(auVar254,auVar254,0xff);
  uStack_620 = auVar217._0_8_;
  local_628 = (undefined1  [8])uStack_620;
  uStack_618 = uStack_620;
  uStack_610 = uStack_620;
  auVar20._4_4_ = fVar61 * fVar88;
  auVar20._0_4_ = fVar61 * fVar86;
  auVar20._8_4_ = fVar61 * fVar124;
  auVar20._12_4_ = fVar61 * fVar85;
  auVar20._16_4_ = fVar61 * 0.0;
  auVar20._20_4_ = fVar61 * 0.0;
  auVar20._24_4_ = fVar61 * 0.0;
  auVar20._28_4_ = fVar61;
  auVar254 = vfmadd231ps_fma(auVar20,auVar81,auVar194);
  auVar217 = vshufps_avx(auVar158,auVar158,0xaa);
  auVar195._0_8_ = auVar217._0_8_;
  auVar195._8_8_ = auVar195._0_8_;
  auVar195._16_8_ = auVar195._0_8_;
  auVar195._24_8_ = auVar195._0_8_;
  auVar218 = vshufps_avx(auVar158,auVar158,0xff);
  local_4e8._8_8_ = auVar218._0_8_;
  local_4e8._0_8_ = local_4e8._8_8_;
  local_4e8._16_8_ = local_4e8._8_8_;
  local_4e8._24_8_ = local_4e8._8_8_;
  fVar87 = auVar234._0_4_;
  fVar149 = auVar234._4_4_;
  auVar21._4_4_ = fVar149 * fVar88;
  auVar21._0_4_ = fVar87 * fVar86;
  auVar21._8_4_ = fVar87 * fVar124;
  auVar21._12_4_ = fVar149 * fVar85;
  auVar21._16_4_ = fVar87 * 0.0;
  auVar21._20_4_ = fVar149 * 0.0;
  auVar21._24_4_ = fVar87 * 0.0;
  auVar21._28_4_ = auVar151._4_4_;
  auVar93 = vfmadd231ps_fma(auVar21,auVar81,auVar213);
  auVar261._28_4_ = fVar149;
  auVar261._0_28_ =
       ZEXT1628(CONCAT412(auVar128._12_4_ * fVar85,
                          CONCAT48(auVar128._8_4_ * fVar124,
                                   CONCAT44(auVar128._4_4_ * fVar88,auVar128._0_4_ * fVar86))));
  auVar66 = vfmadd231ps_fma(auVar261,auVar81,ZEXT1632(auVar66));
  fVar87 = auVar218._4_4_;
  auVar23._28_4_ = fVar87;
  auVar23._0_28_ =
       ZEXT1628(CONCAT412(auVar92._12_4_ * fVar85,
                          CONCAT48(auVar92._8_4_ * fVar124,
                                   CONCAT44(auVar92._4_4_ * fVar88,auVar92._0_4_ * fVar86))));
  auVar67 = vfmadd231ps_fma(auVar23,auVar81,ZEXT1632(auVar67));
  auVar151 = vshufps_avx(auVar131,auVar131,0xaa);
  uVar89 = auVar151._0_8_;
  auVar183._8_8_ = uVar89;
  auVar183._0_8_ = uVar89;
  auVar183._16_8_ = uVar89;
  auVar183._24_8_ = uVar89;
  auVar234 = vshufps_avx(auVar131,auVar131,0xff);
  uVar89 = auVar234._0_8_;
  auVar285._8_8_ = uVar89;
  auVar285._0_8_ = uVar89;
  auVar285._16_8_ = uVar89;
  auVar285._24_8_ = uVar89;
  auVar131 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar254._12_4_ * fVar85,
                                                CONCAT48(auVar254._8_4_ * fVar124,
                                                         CONCAT44(auVar254._4_4_ * fVar88,
                                                                  auVar254._0_4_ * fVar86)))),
                             auVar81,ZEXT1632(auVar128));
  auVar254 = vshufps_avx(auVar246,auVar246,0xaa);
  auVar158 = vshufps_avx(auVar246,auVar246,0xff);
  auVar246 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar85 * auVar93._12_4_,
                                                CONCAT48(fVar124 * auVar93._8_4_,
                                                         CONCAT44(fVar88 * auVar93._4_4_,
                                                                  fVar86 * auVar93._0_4_)))),auVar81
                             ,ZEXT1632(auVar92));
  auVar128 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar85 * auVar131._12_4_,
                                                CONCAT48(fVar124 * auVar131._8_4_,
                                                         CONCAT44(fVar88 * auVar131._4_4_,
                                                                  fVar86 * auVar131._0_4_)))),
                             auVar81,ZEXT1632(auVar66));
  auVar17 = vsubps_avx(ZEXT1632(auVar131),ZEXT1632(auVar66));
  auVar131 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar85 * auVar246._12_4_,
                                                CONCAT48(fVar124 * auVar246._8_4_,
                                                         CONCAT44(fVar88 * auVar246._4_4_,
                                                                  fVar86 * auVar246._0_4_)))),
                             auVar81,ZEXT1632(auVar67));
  auVar18 = vsubps_avx(ZEXT1632(auVar246),ZEXT1632(auVar67));
  fVar149 = auVar18._28_4_;
  auVar260._0_4_ = fStack_140 * auVar17._0_4_ * 3.0;
  auVar260._4_4_ = fStack_140 * auVar17._4_4_ * 3.0;
  auVar260._8_4_ = fStack_140 * auVar17._8_4_ * 3.0;
  auVar260._12_4_ = fStack_140 * auVar17._12_4_ * 3.0;
  auVar260._16_4_ = fStack_140 * auVar17._16_4_ * 3.0;
  auVar260._20_4_ = fStack_140 * auVar17._20_4_ * 3.0;
  auVar260._24_4_ = fStack_140 * auVar17._24_4_ * 3.0;
  auVar260._28_4_ = 0;
  local_418._0_4_ = fStack_140 * auVar18._0_4_ * 3.0;
  local_418._4_4_ = fStack_140 * auVar18._4_4_ * 3.0;
  fStack_410 = fStack_140 * auVar18._8_4_ * 3.0;
  fStack_40c = fStack_140 * auVar18._12_4_ * 3.0;
  fStack_408 = fStack_140 * auVar18._16_4_ * 3.0;
  fStack_404 = fStack_140 * auVar18._20_4_ * 3.0;
  fStack_400 = fStack_140 * auVar18._24_4_ * 3.0;
  fStack_3fc = fVar149;
  fVar61 = auVar217._0_4_;
  fVar233 = auVar217._4_4_;
  auVar24._4_4_ = fVar233 * fVar88;
  auVar24._0_4_ = fVar61 * fVar86;
  auVar24._8_4_ = fVar61 * fVar124;
  auVar24._12_4_ = fVar233 * fVar85;
  auVar24._16_4_ = fVar61 * 0.0;
  auVar24._20_4_ = fVar233 * 0.0;
  auVar24._24_4_ = fVar61 * 0.0;
  auVar24._28_4_ = fVar149;
  auVar217 = vfmadd231ps_fma(auVar24,auVar81,local_578);
  fVar61 = auVar218._0_4_;
  auVar25._4_4_ = fVar87 * fVar88;
  auVar25._0_4_ = fVar61 * fVar86;
  auVar25._8_4_ = fVar61 * fVar124;
  auVar25._12_4_ = fVar87 * fVar85;
  auVar25._16_4_ = fVar61 * 0.0;
  auVar25._20_4_ = fVar87 * 0.0;
  auVar25._24_4_ = fVar61 * 0.0;
  auVar25._28_4_ = 0;
  auVar218 = vfmadd231ps_fma(auVar25,auVar81,_local_628);
  fVar87 = auVar151._0_4_;
  fVar61 = auVar151._4_4_;
  auVar26._4_4_ = fVar61 * fVar88;
  auVar26._0_4_ = fVar87 * fVar86;
  auVar26._8_4_ = fVar87 * fVar124;
  auVar26._12_4_ = fVar61 * fVar85;
  auVar26._16_4_ = fVar87 * 0.0;
  auVar26._20_4_ = fVar61 * 0.0;
  auVar26._24_4_ = fVar87 * 0.0;
  auVar26._28_4_ = auVar17._28_4_;
  auVar151 = vfmadd231ps_fma(auVar26,auVar81,auVar195);
  fVar87 = auVar234._0_4_;
  fVar137 = auVar234._4_4_;
  auVar27._4_4_ = fVar137 * fVar88;
  auVar27._0_4_ = fVar87 * fVar86;
  auVar27._8_4_ = fVar87 * fVar124;
  auVar27._12_4_ = fVar137 * fVar85;
  auVar27._16_4_ = fVar87 * 0.0;
  auVar27._20_4_ = fVar137 * 0.0;
  auVar27._24_4_ = fVar87 * 0.0;
  auVar27._28_4_ = fVar233;
  auVar234 = vfmadd231ps_fma(auVar27,auVar81,local_4e8);
  local_4e8 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar128));
  fVar87 = auVar254._0_4_;
  fVar61 = auVar254._4_4_;
  auVar28._4_4_ = fVar61 * fVar88;
  auVar28._0_4_ = fVar87 * fVar86;
  auVar28._8_4_ = fVar87 * fVar124;
  auVar28._12_4_ = fVar61 * fVar85;
  auVar28._16_4_ = fVar87 * 0.0;
  auVar28._20_4_ = fVar61 * 0.0;
  auVar28._24_4_ = fVar87 * 0.0;
  auVar28._28_4_ = fVar61;
  auVar254 = vfmadd231ps_fma(auVar28,auVar81,auVar183);
  auVar20 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar131));
  fVar87 = auVar158._0_4_;
  fVar61 = auVar158._4_4_;
  auVar29._4_4_ = fVar61 * fVar88;
  auVar29._0_4_ = fVar87 * fVar86;
  auVar29._8_4_ = fVar87 * fVar124;
  auVar29._12_4_ = fVar61 * fVar85;
  auVar29._16_4_ = fVar87 * 0.0;
  auVar29._20_4_ = fVar61 * 0.0;
  auVar29._24_4_ = fVar87 * 0.0;
  auVar29._28_4_ = fVar61;
  auVar158 = vfmadd231ps_fma(auVar29,auVar81,auVar285);
  auVar30._28_4_ = fVar137;
  auVar30._0_28_ =
       ZEXT1628(CONCAT412(auVar151._12_4_ * fVar85,
                          CONCAT48(auVar151._8_4_ * fVar124,
                                   CONCAT44(auVar151._4_4_ * fVar88,auVar151._0_4_ * fVar86))));
  auVar217 = vfmadd231ps_fma(auVar30,auVar81,ZEXT1632(auVar217));
  auVar218 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar85 * auVar234._12_4_,
                                                CONCAT48(fVar124 * auVar234._8_4_,
                                                         CONCAT44(fVar88 * auVar234._4_4_,
                                                                  fVar86 * auVar234._0_4_)))),
                             auVar81,ZEXT1632(auVar218));
  auVar108._0_4_ = auVar128._0_4_ + auVar260._0_4_;
  auVar108._4_4_ = auVar128._4_4_ + auVar260._4_4_;
  auVar108._8_4_ = auVar128._8_4_ + auVar260._8_4_;
  auVar108._12_4_ = auVar128._12_4_ + auVar260._12_4_;
  auVar108._16_4_ = auVar260._16_4_ + 0.0;
  auVar108._20_4_ = auVar260._20_4_ + 0.0;
  auVar108._24_4_ = auVar260._24_4_ + 0.0;
  auVar108._28_4_ = 0;
  auVar151 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar254._12_4_ * fVar85,
                                                CONCAT48(auVar254._8_4_ * fVar124,
                                                         CONCAT44(auVar254._4_4_ * fVar88,
                                                                  auVar254._0_4_ * fVar86)))),
                             auVar81,ZEXT1632(auVar151));
  auVar234 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar158._12_4_ * fVar85,
                                                CONCAT48(auVar158._8_4_ * fVar124,
                                                         CONCAT44(auVar158._4_4_ * fVar88,
                                                                  auVar158._0_4_ * fVar86)))),
                             auVar81,ZEXT1632(auVar234));
  auVar254 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar85 * auVar151._12_4_,
                                                CONCAT48(fVar124 * auVar151._8_4_,
                                                         CONCAT44(fVar88 * auVar151._4_4_,
                                                                  fVar86 * auVar151._0_4_)))),
                             auVar81,ZEXT1632(auVar217));
  auVar158 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar234._12_4_ * fVar85,
                                                CONCAT48(auVar234._8_4_ * fVar124,
                                                         CONCAT44(auVar234._4_4_ * fVar88,
                                                                  auVar234._0_4_ * fVar86)))),
                             ZEXT1632(auVar218),auVar81);
  auVar81 = vsubps_avx(ZEXT1632(auVar151),ZEXT1632(auVar217));
  auVar17 = vsubps_avx(ZEXT1632(auVar234),ZEXT1632(auVar218));
  auVar279._0_4_ = fStack_140 * auVar81._0_4_ * 3.0;
  auVar279._4_4_ = fStack_140 * auVar81._4_4_ * 3.0;
  auVar279._8_4_ = fStack_140 * auVar81._8_4_ * 3.0;
  auVar279._12_4_ = fStack_140 * auVar81._12_4_ * 3.0;
  auVar279._16_4_ = fStack_140 * auVar81._16_4_ * 3.0;
  auVar279._20_4_ = fStack_140 * auVar81._20_4_ * 3.0;
  auVar279._24_4_ = fStack_140 * auVar81._24_4_ * 3.0;
  auVar279._28_4_ = 0;
  local_158 = fStack_140 * auVar17._0_4_ * 3.0;
  fStack_154 = fStack_140 * auVar17._4_4_ * 3.0;
  auVar31._4_4_ = fStack_154;
  auVar31._0_4_ = local_158;
  fStack_150 = fStack_140 * auVar17._8_4_ * 3.0;
  auVar31._8_4_ = fStack_150;
  fStack_14c = fStack_140 * auVar17._12_4_ * 3.0;
  auVar31._12_4_ = fStack_14c;
  fStack_148 = fStack_140 * auVar17._16_4_ * 3.0;
  auVar31._16_4_ = fStack_148;
  fStack_144 = fStack_140 * auVar17._20_4_ * 3.0;
  auVar31._20_4_ = fStack_144;
  fStack_140 = fStack_140 * auVar17._24_4_ * 3.0;
  auVar31._24_4_ = fStack_140;
  auVar31._28_4_ = 0x40400000;
  _local_508 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar254));
  auVar21 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar158));
  auVar81 = vsubps_avx(ZEXT1632(auVar254),ZEXT1632(auVar128));
  auVar17 = vsubps_avx(ZEXT1632(auVar158),ZEXT1632(auVar131));
  auVar18 = vsubps_avx(_local_508,local_4e8);
  fVar273 = auVar81._0_4_ + auVar18._0_4_;
  fVar197 = auVar81._4_4_ + auVar18._4_4_;
  fVar198 = auVar81._8_4_ + auVar18._8_4_;
  fVar199 = auVar81._12_4_ + auVar18._12_4_;
  fVar200 = auVar81._16_4_ + auVar18._16_4_;
  fVar201 = auVar81._20_4_ + auVar18._20_4_;
  fVar202 = auVar81._24_4_ + auVar18._24_4_;
  auVar19 = vsubps_avx(auVar21,auVar20);
  auVar82._0_4_ = auVar17._0_4_ + auVar19._0_4_;
  auVar82._4_4_ = auVar17._4_4_ + auVar19._4_4_;
  auVar82._8_4_ = auVar17._8_4_ + auVar19._8_4_;
  auVar82._12_4_ = auVar17._12_4_ + auVar19._12_4_;
  auVar82._16_4_ = auVar17._16_4_ + auVar19._16_4_;
  auVar82._20_4_ = auVar17._20_4_ + auVar19._20_4_;
  auVar82._24_4_ = auVar17._24_4_ + auVar19._24_4_;
  auVar82._28_4_ = auVar17._28_4_ + auVar19._28_4_;
  local_f8 = ZEXT1632(auVar131);
  fVar86 = auVar131._0_4_;
  local_178 = (float)local_418._0_4_ + fVar86;
  fVar88 = auVar131._4_4_;
  fStack_174 = (float)local_418._4_4_ + fVar88;
  fVar124 = auVar131._8_4_;
  fStack_170 = fStack_410 + fVar124;
  fVar85 = auVar131._12_4_;
  fStack_16c = fStack_40c + fVar85;
  fStack_168 = fStack_408 + 0.0;
  fStack_164 = fStack_404 + 0.0;
  fStack_160 = fStack_400 + 0.0;
  local_b8 = ZEXT1632(auVar128);
  auVar17 = vsubps_avx(local_b8,auVar260);
  local_d8 = vpermps_avx2(_DAT_01fb7720,auVar17);
  auVar17 = vsubps_avx(local_f8,_local_418);
  local_198 = vpermps_avx2(_DAT_01fb7720,auVar17);
  local_118._0_4_ = auVar254._0_4_ + auVar279._0_4_;
  local_118._4_4_ = auVar254._4_4_ + auVar279._4_4_;
  local_118._8_4_ = auVar254._8_4_ + auVar279._8_4_;
  local_118._12_4_ = auVar254._12_4_ + auVar279._12_4_;
  local_118._16_4_ = auVar279._16_4_ + 0.0;
  local_118._20_4_ = auVar279._20_4_ + 0.0;
  local_118._24_4_ = auVar279._24_4_ + 0.0;
  local_118._28_4_ = 0;
  auVar261 = ZEXT1632(auVar254);
  auVar17 = vsubps_avx(auVar261,auVar279);
  _local_418 = vpermps_avx2(_DAT_01fb7720,auVar17);
  fVar87 = auVar158._0_4_;
  local_158 = fVar87 + local_158;
  fVar61 = auVar158._4_4_;
  fStack_154 = fVar61 + fStack_154;
  fVar233 = auVar158._8_4_;
  fStack_150 = fVar233 + fStack_150;
  fVar137 = auVar158._12_4_;
  fStack_14c = fVar137 + fStack_14c;
  fStack_148 = fStack_148 + 0.0;
  fStack_144 = fStack_144 + 0.0;
  fStack_140 = fStack_140 + 0.0;
  auVar17 = vsubps_avx(ZEXT1632(auVar158),auVar31);
  local_138 = vpermps_avx2(_DAT_01fb7720,auVar17);
  auVar32._4_4_ = fVar88 * fVar197;
  auVar32._0_4_ = fVar86 * fVar273;
  auVar32._8_4_ = fVar124 * fVar198;
  auVar32._12_4_ = fVar85 * fVar199;
  auVar32._16_4_ = fVar200 * 0.0;
  auVar32._20_4_ = fVar201 * 0.0;
  auVar32._24_4_ = fVar202 * 0.0;
  auVar32._28_4_ = auVar17._28_4_;
  auVar151 = vfnmadd231ps_fma(auVar32,local_b8,auVar82);
  fStack_15c = fVar149 + 0.0;
  auVar33._4_4_ = fStack_174 * fVar197;
  auVar33._0_4_ = local_178 * fVar273;
  auVar33._8_4_ = fStack_170 * fVar198;
  auVar33._12_4_ = fStack_16c * fVar199;
  auVar33._16_4_ = fStack_168 * fVar200;
  auVar33._20_4_ = fStack_164 * fVar201;
  auVar33._24_4_ = fStack_160 * fVar202;
  auVar33._28_4_ = 0;
  auVar217 = vfnmadd231ps_fma(auVar33,auVar82,auVar108);
  auVar34._4_4_ = local_198._4_4_ * fVar197;
  auVar34._0_4_ = local_198._0_4_ * fVar273;
  auVar34._8_4_ = local_198._8_4_ * fVar198;
  auVar34._12_4_ = local_198._12_4_ * fVar199;
  auVar34._16_4_ = local_198._16_4_ * fVar200;
  auVar34._20_4_ = local_198._20_4_ * fVar201;
  auVar34._24_4_ = local_198._24_4_ * fVar202;
  auVar34._28_4_ = fVar149 + 0.0;
  auVar218 = vfnmadd231ps_fma(auVar34,local_d8,auVar82);
  local_628._0_4_ = auVar20._0_4_;
  local_628._4_4_ = auVar20._4_4_;
  uStack_620._0_4_ = auVar20._8_4_;
  uStack_620._4_4_ = auVar20._12_4_;
  uStack_618._0_4_ = auVar20._16_4_;
  uStack_618._4_4_ = auVar20._20_4_;
  uStack_610._0_4_ = auVar20._24_4_;
  uStack_610._4_4_ = auVar20._28_4_;
  auVar35._4_4_ = (float)local_628._4_4_ * fVar197;
  auVar35._0_4_ = (float)local_628._0_4_ * fVar273;
  auVar35._8_4_ = (float)uStack_620 * fVar198;
  auVar35._12_4_ = uStack_620._4_4_ * fVar199;
  auVar35._16_4_ = (float)uStack_618 * fVar200;
  auVar35._20_4_ = uStack_618._4_4_ * fVar201;
  auVar35._24_4_ = (float)uStack_610 * fVar202;
  auVar35._28_4_ = uStack_610._4_4_;
  auVar234 = vfnmadd231ps_fma(auVar35,local_4e8,auVar82);
  auVar214._0_4_ = fVar87 * fVar273;
  auVar214._4_4_ = fVar61 * fVar197;
  auVar214._8_4_ = fVar233 * fVar198;
  auVar214._12_4_ = fVar137 * fVar199;
  auVar214._16_4_ = fVar200 * 0.0;
  auVar214._20_4_ = fVar201 * 0.0;
  auVar214._24_4_ = fVar202 * 0.0;
  auVar214._28_4_ = 0;
  auVar254 = vfnmadd231ps_fma(auVar214,auVar261,auVar82);
  uStack_13c = 0x40400000;
  auVar36._4_4_ = fStack_154 * fVar197;
  auVar36._0_4_ = local_158 * fVar273;
  auVar36._8_4_ = fStack_150 * fVar198;
  auVar36._12_4_ = fStack_14c * fVar199;
  auVar36._16_4_ = fStack_148 * fVar200;
  auVar36._20_4_ = fStack_144 * fVar201;
  auVar36._24_4_ = fStack_140 * fVar202;
  auVar36._28_4_ = local_4e8._28_4_;
  auVar131 = vfnmadd231ps_fma(auVar36,local_118,auVar82);
  auVar37._4_4_ = local_138._4_4_ * fVar197;
  auVar37._0_4_ = local_138._0_4_ * fVar273;
  auVar37._8_4_ = local_138._8_4_ * fVar198;
  auVar37._12_4_ = local_138._12_4_ * fVar199;
  auVar37._16_4_ = local_138._16_4_ * fVar200;
  auVar37._20_4_ = local_138._20_4_ * fVar201;
  auVar37._24_4_ = local_138._24_4_ * fVar202;
  auVar37._28_4_ = local_138._28_4_;
  auVar246 = vfnmadd231ps_fma(auVar37,_local_418,auVar82);
  auVar38._4_4_ = auVar21._4_4_ * fVar197;
  auVar38._0_4_ = auVar21._0_4_ * fVar273;
  auVar38._8_4_ = auVar21._8_4_ * fVar198;
  auVar38._12_4_ = auVar21._12_4_ * fVar199;
  auVar38._16_4_ = auVar21._16_4_ * fVar200;
  auVar38._20_4_ = auVar21._20_4_ * fVar201;
  auVar38._24_4_ = auVar21._24_4_ * fVar202;
  auVar38._28_4_ = auVar81._28_4_ + auVar18._28_4_;
  auVar231 = ZEXT3264(_local_508);
  auVar66 = vfnmadd231ps_fma(auVar38,_local_508,auVar82);
  auVar17 = vminps_avx(ZEXT1632(auVar151),ZEXT1632(auVar217));
  auVar81 = vmaxps_avx(ZEXT1632(auVar151),ZEXT1632(auVar217));
  auVar18 = vminps_avx(ZEXT1632(auVar218),ZEXT1632(auVar234));
  auVar18 = vminps_avx(auVar17,auVar18);
  auVar17 = vmaxps_avx(ZEXT1632(auVar218),ZEXT1632(auVar234));
  auVar81 = vmaxps_avx(auVar81,auVar17);
  auVar19 = vminps_avx(ZEXT1632(auVar254),ZEXT1632(auVar131));
  auVar17 = vmaxps_avx(ZEXT1632(auVar254),ZEXT1632(auVar131));
  auVar12 = vminps_avx(ZEXT1632(auVar246),ZEXT1632(auVar66));
  auVar19 = vminps_avx(auVar19,auVar12);
  auVar19 = vminps_avx(auVar18,auVar19);
  auVar18 = vmaxps_avx(ZEXT1632(auVar246),ZEXT1632(auVar66));
  auVar17 = vmaxps_avx(auVar17,auVar18);
  auVar17 = vmaxps_avx(auVar81,auVar17);
  auVar47._4_4_ = fStack_74;
  auVar47._0_4_ = local_78;
  auVar47._8_4_ = fStack_70;
  auVar47._12_4_ = fStack_6c;
  auVar47._16_4_ = fStack_68;
  auVar47._20_4_ = fStack_64;
  auVar47._24_4_ = fStack_60;
  auVar47._28_4_ = fStack_5c;
  auVar81 = vcmpps_avx(auVar19,auVar47,2);
  auVar46._4_4_ = fStack_94;
  auVar46._0_4_ = local_98;
  auVar46._8_4_ = fStack_90;
  auVar46._12_4_ = fStack_8c;
  auVar46._16_4_ = fStack_88;
  auVar46._20_4_ = fStack_84;
  auVar46._24_4_ = fStack_80;
  auVar46._28_4_ = fStack_7c;
  auVar17 = vcmpps_avx(auVar17,auVar46,5);
  auVar81 = vandps_avx(auVar17,auVar81);
  auVar17 = local_1b8 & auVar81;
  if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar17 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar17 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar17 >> 0x7f,0) != '\0') ||
        (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar17 >> 0xbf,0) != '\0') ||
      (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar17[0x1f] < '\0') {
    auVar17 = vsubps_avx(local_4e8,local_b8);
    auVar18 = vsubps_avx(_local_508,auVar261);
    fVar273 = auVar17._0_4_ + auVar18._0_4_;
    fVar197 = auVar17._4_4_ + auVar18._4_4_;
    fVar198 = auVar17._8_4_ + auVar18._8_4_;
    fVar199 = auVar17._12_4_ + auVar18._12_4_;
    fVar200 = auVar17._16_4_ + auVar18._16_4_;
    fVar201 = auVar17._20_4_ + auVar18._20_4_;
    fVar202 = auVar17._24_4_ + auVar18._24_4_;
    auVar19 = vsubps_avx(auVar20,local_f8);
    auVar12 = vsubps_avx(auVar21,ZEXT1632(auVar158));
    auVar109._0_4_ = auVar19._0_4_ + auVar12._0_4_;
    auVar109._4_4_ = auVar19._4_4_ + auVar12._4_4_;
    auVar109._8_4_ = auVar19._8_4_ + auVar12._8_4_;
    auVar109._12_4_ = auVar19._12_4_ + auVar12._12_4_;
    auVar109._16_4_ = auVar19._16_4_ + auVar12._16_4_;
    auVar109._20_4_ = auVar19._20_4_ + auVar12._20_4_;
    auVar109._24_4_ = auVar19._24_4_ + auVar12._24_4_;
    fVar149 = auVar12._28_4_;
    auVar109._28_4_ = auVar19._28_4_ + fVar149;
    auVar39._4_4_ = fVar88 * fVar197;
    auVar39._0_4_ = fVar86 * fVar273;
    auVar39._8_4_ = fVar124 * fVar198;
    auVar39._12_4_ = fVar85 * fVar199;
    auVar39._16_4_ = fVar200 * 0.0;
    auVar39._20_4_ = fVar201 * 0.0;
    auVar39._24_4_ = fVar202 * 0.0;
    auVar39._28_4_ = auVar21._28_4_;
    auVar254 = vfnmadd231ps_fma(auVar39,auVar109,local_b8);
    auVar40._4_4_ = fVar197 * fStack_174;
    auVar40._0_4_ = fVar273 * local_178;
    auVar40._8_4_ = fVar198 * fStack_170;
    auVar40._12_4_ = fVar199 * fStack_16c;
    auVar40._16_4_ = fVar200 * fStack_168;
    auVar40._20_4_ = fVar201 * fStack_164;
    auVar40._24_4_ = fVar202 * fStack_160;
    auVar40._28_4_ = 0;
    auVar151 = vfnmadd213ps_fma(auVar108,auVar109,auVar40);
    auVar41._4_4_ = fVar197 * local_198._4_4_;
    auVar41._0_4_ = fVar273 * local_198._0_4_;
    auVar41._8_4_ = fVar198 * local_198._8_4_;
    auVar41._12_4_ = fVar199 * local_198._12_4_;
    auVar41._16_4_ = fVar200 * local_198._16_4_;
    auVar41._20_4_ = fVar201 * local_198._20_4_;
    auVar41._24_4_ = fVar202 * local_198._24_4_;
    auVar41._28_4_ = 0;
    auVar217 = vfnmadd213ps_fma(local_d8,auVar109,auVar41);
    auVar42._4_4_ = (float)local_628._4_4_ * fVar197;
    auVar42._0_4_ = (float)local_628._0_4_ * fVar273;
    auVar42._8_4_ = (float)uStack_620 * fVar198;
    auVar42._12_4_ = uStack_620._4_4_ * fVar199;
    auVar42._16_4_ = (float)uStack_618 * fVar200;
    auVar42._20_4_ = uStack_618._4_4_ * fVar201;
    auVar42._24_4_ = (float)uStack_610 * fVar202;
    auVar42._28_4_ = 0;
    auVar158 = vfnmadd231ps_fma(auVar42,auVar109,local_4e8);
    auVar135._0_4_ = fVar87 * fVar273;
    auVar135._4_4_ = fVar61 * fVar197;
    auVar135._8_4_ = fVar233 * fVar198;
    auVar135._12_4_ = fVar137 * fVar199;
    auVar135._16_4_ = fVar200 * 0.0;
    auVar135._20_4_ = fVar201 * 0.0;
    auVar135._24_4_ = fVar202 * 0.0;
    auVar135._28_4_ = 0;
    auVar131 = vfnmadd231ps_fma(auVar135,auVar109,auVar261);
    auVar43._4_4_ = fVar197 * fStack_154;
    auVar43._0_4_ = fVar273 * local_158;
    auVar43._8_4_ = fVar198 * fStack_150;
    auVar43._12_4_ = fVar199 * fStack_14c;
    auVar43._16_4_ = fVar200 * fStack_148;
    auVar43._20_4_ = fVar201 * fStack_144;
    auVar43._24_4_ = fVar202 * fStack_140;
    auVar43._28_4_ = fVar149;
    auVar218 = vfnmadd213ps_fma(local_118,auVar109,auVar43);
    auVar44._4_4_ = fVar197 * local_138._4_4_;
    auVar44._0_4_ = fVar273 * local_138._0_4_;
    auVar44._8_4_ = fVar198 * local_138._8_4_;
    auVar44._12_4_ = fVar199 * local_138._12_4_;
    auVar44._16_4_ = fVar200 * local_138._16_4_;
    auVar44._20_4_ = fVar201 * local_138._20_4_;
    auVar44._24_4_ = fVar202 * local_138._24_4_;
    auVar44._28_4_ = fVar149;
    auVar234 = vfnmadd213ps_fma(_local_418,auVar109,auVar44);
    auVar231 = ZEXT1664(auVar234);
    auVar45._4_4_ = fVar197 * auVar21._4_4_;
    auVar45._0_4_ = fVar273 * auVar21._0_4_;
    auVar45._8_4_ = fVar198 * auVar21._8_4_;
    auVar45._12_4_ = fVar199 * auVar21._12_4_;
    auVar45._16_4_ = fVar200 * auVar21._16_4_;
    auVar45._20_4_ = fVar201 * auVar21._20_4_;
    auVar45._24_4_ = fVar202 * auVar21._24_4_;
    auVar45._28_4_ = auVar17._28_4_ + auVar18._28_4_;
    auVar246 = vfnmadd231ps_fma(auVar45,auVar109,_local_508);
    auVar18 = vminps_avx(ZEXT1632(auVar254),ZEXT1632(auVar151));
    auVar17 = vmaxps_avx(ZEXT1632(auVar254),ZEXT1632(auVar151));
    auVar19 = vminps_avx(ZEXT1632(auVar217),ZEXT1632(auVar158));
    auVar19 = vminps_avx(auVar18,auVar19);
    auVar18 = vmaxps_avx(ZEXT1632(auVar217),ZEXT1632(auVar158));
    auVar17 = vmaxps_avx(auVar17,auVar18);
    auVar12 = vminps_avx(ZEXT1632(auVar131),ZEXT1632(auVar218));
    auVar18 = vmaxps_avx(ZEXT1632(auVar131),ZEXT1632(auVar218));
    auVar20 = vminps_avx(ZEXT1632(auVar234),ZEXT1632(auVar246));
    auVar12 = vminps_avx(auVar12,auVar20);
    auVar12 = vminps_avx(auVar19,auVar12);
    auVar19 = vmaxps_avx(ZEXT1632(auVar234),ZEXT1632(auVar246));
    auVar18 = vmaxps_avx(auVar18,auVar19);
    auVar18 = vmaxps_avx(auVar17,auVar18);
    auVar17 = vcmpps_avx(auVar12,auVar47,2);
    auVar18 = vcmpps_avx(auVar18,auVar46,5);
    auVar17 = vandps_avx(auVar18,auVar17);
    auVar81 = vandps_avx(auVar81,local_1b8);
    auVar18 = auVar81 & auVar17;
    if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar18 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar18 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar18 >> 0x7f,0) != '\0') ||
          (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar18 >> 0xbf,0) != '\0') ||
        (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar18[0x1f] < '\0')
    {
      auVar81 = vandps_avx(auVar17,auVar81);
      uVar53 = vmovmskps_avx(auVar81);
      if (uVar53 != 0) {
        mask_stack[uVar50] = uVar53 & 0xff;
        BVar2 = (BBox1f)vmovlps_avx(auVar10);
        cu_stack[uVar50] = BVar2;
        BVar2 = (BBox1f)vmovlps_avx(auVar68);
        cv_stack[uVar50] = BVar2;
        uVar50 = (ulong)((int)uVar50 + 1);
      }
    }
  }
LAB_011345c7:
  if ((int)uVar50 != 0) {
    uVar49 = (int)uVar50 - 1;
    uVar53 = mask_stack[uVar49];
    fVar86 = cu_stack[uVar49].lower;
    fVar88 = cu_stack[uVar49].upper;
    iVar22 = 0;
    for (uVar55 = (ulong)uVar53; (uVar55 & 1) == 0; uVar55 = uVar55 >> 1 | 0x8000000000000000) {
      iVar22 = iVar22 + 1;
    }
    uVar53 = uVar53 - 1 & uVar53;
    if (uVar53 == 0) {
      uVar50 = (ulong)uVar49;
    }
    auVar68._8_8_ = 0;
    auVar68._0_4_ = cv_stack[uVar49].lower;
    auVar68._4_4_ = cv_stack[uVar49].upper;
    mask_stack[uVar49] = uVar53;
    fVar124 = (float)(iVar22 + 1) * 0.14285715;
    auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar88 * (float)iVar22 * 0.14285715)),
                              ZEXT416((uint)fVar86),
                              ZEXT416((uint)(1.0 - (float)iVar22 * 0.14285715)));
    auVar151 = vfmadd231ss_fma(ZEXT416((uint)(fVar88 * fVar124)),ZEXT416((uint)fVar86),
                               ZEXT416((uint)(1.0 - fVar124)));
    fVar88 = auVar151._0_4_;
    auVar196._0_4_ = auVar10._0_4_;
    fVar86 = fVar88 - auVar196._0_4_;
    if (fVar86 < 0.16666667) {
      auVar217 = vshufps_avx(auVar68,auVar68,0x50);
      auVar95._8_4_ = 0x3f800000;
      auVar95._0_8_ = 0x3f8000003f800000;
      auVar95._12_4_ = 0x3f800000;
      auVar218 = vsubps_avx(auVar95,auVar217);
      fVar124 = auVar217._0_4_;
      auVar143._0_4_ = fVar124 * fVar138;
      fVar85 = auVar217._4_4_;
      auVar143._4_4_ = fVar85 * fVar262;
      fVar87 = auVar217._8_4_;
      auVar143._8_4_ = fVar87 * fVar138;
      fVar149 = auVar217._12_4_;
      auVar143._12_4_ = fVar149 * fVar262;
      auVar156._0_4_ = fVar124 * fVar271;
      auVar156._4_4_ = fVar85 * fVar272;
      auVar156._8_4_ = fVar87 * fVar271;
      auVar156._12_4_ = fVar149 * fVar272;
      auVar180._0_4_ = fVar124 * fVar203;
      auVar180._4_4_ = fVar85 * fVar215;
      auVar180._8_4_ = fVar87 * fVar203;
      auVar180._12_4_ = fVar149 * fVar215;
      auVar70._0_4_ = fVar124 * fVar216;
      auVar70._4_4_ = fVar85 * fVar232;
      auVar70._8_4_ = fVar87 * fVar216;
      auVar70._12_4_ = fVar149 * fVar232;
      auVar217 = vfmadd231ps_fma(auVar143,auVar218,auVar191);
      auVar234 = vfmadd231ps_fma(auVar156,auVar218,auVar236);
      auVar254 = vfmadd231ps_fma(auVar180,auVar218,auVar253);
      auVar218 = vfmadd231ps_fma(auVar70,auVar218,auVar264);
      auVar136._16_16_ = auVar217;
      auVar136._0_16_ = auVar217;
      auVar148._16_16_ = auVar234;
      auVar148._0_16_ = auVar234;
      auVar165._16_16_ = auVar254;
      auVar165._0_16_ = auVar254;
      auVar196._4_4_ = auVar196._0_4_;
      auVar196._8_4_ = auVar196._0_4_;
      auVar196._12_4_ = auVar196._0_4_;
      auVar196._20_4_ = fVar88;
      auVar196._16_4_ = fVar88;
      auVar196._24_4_ = fVar88;
      auVar196._28_4_ = fVar88;
      auVar81 = vsubps_avx(auVar148,auVar136);
      auVar234 = vfmadd213ps_fma(auVar81,auVar196,auVar136);
      auVar81 = vsubps_avx(auVar165,auVar148);
      auVar158 = vfmadd213ps_fma(auVar81,auVar196,auVar148);
      auVar217 = vsubps_avx(auVar218,auVar254);
      auVar83._16_16_ = auVar217;
      auVar83._0_16_ = auVar217;
      auVar217 = vfmadd213ps_fma(auVar83,auVar196,auVar165);
      auVar81 = vsubps_avx(ZEXT1632(auVar158),ZEXT1632(auVar234));
      auVar218 = vfmadd213ps_fma(auVar81,auVar196,ZEXT1632(auVar234));
      auVar81 = vsubps_avx(ZEXT1632(auVar217),ZEXT1632(auVar158));
      auVar217 = vfmadd213ps_fma(auVar81,auVar196,ZEXT1632(auVar158));
      auVar81 = vsubps_avx(ZEXT1632(auVar217),ZEXT1632(auVar218));
      auVar66 = vfmadd231ps_fma(ZEXT1632(auVar218),auVar81,auVar196);
      fVar233 = auVar81._4_4_ * 3.0;
      local_4e8._0_4_ = fVar86;
      fVar124 = fVar86 * 0.33333334;
      auVar96._0_8_ =
           CONCAT44(auVar66._4_4_ + fVar124 * fVar233,auVar66._0_4_ + fVar124 * auVar81._0_4_ * 3.0)
      ;
      auVar96._8_4_ = auVar66._8_4_ + fVar124 * auVar81._8_4_ * 3.0;
      auVar96._12_4_ = auVar66._12_4_ + fVar124 * auVar81._12_4_ * 3.0;
      auVar218 = vshufpd_avx(auVar66,auVar66,3);
      auVar234 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      _local_508 = auVar218;
      auVar217 = vsubps_avx(auVar218,auVar66);
      auVar254 = vsubps_avx(auVar234,(undefined1  [16])0x0);
      auVar71._0_4_ = auVar217._0_4_ + auVar254._0_4_;
      auVar71._4_4_ = auVar217._4_4_ + auVar254._4_4_;
      auVar71._8_4_ = auVar217._8_4_ + auVar254._8_4_;
      auVar71._12_4_ = auVar217._12_4_ + auVar254._12_4_;
      auVar217 = vshufps_avx(auVar66,auVar66,0xb1);
      auVar254 = vshufps_avx(auVar96,auVar96,0xb1);
      auVar275._4_4_ = auVar71._0_4_;
      auVar275._0_4_ = auVar71._0_4_;
      auVar275._8_4_ = auVar71._0_4_;
      auVar275._12_4_ = auVar71._0_4_;
      auVar158 = vshufps_avx(auVar71,auVar71,0x55);
      fVar85 = auVar158._0_4_;
      auVar72._0_4_ = fVar85 * auVar217._0_4_;
      fVar87 = auVar158._4_4_;
      auVar72._4_4_ = fVar87 * auVar217._4_4_;
      fVar149 = auVar158._8_4_;
      auVar72._8_4_ = fVar149 * auVar217._8_4_;
      fVar61 = auVar158._12_4_;
      auVar72._12_4_ = fVar61 * auVar217._12_4_;
      auVar157._0_4_ = fVar85 * auVar254._0_4_;
      auVar157._4_4_ = fVar87 * auVar254._4_4_;
      auVar157._8_4_ = fVar149 * auVar254._8_4_;
      auVar157._12_4_ = fVar61 * auVar254._12_4_;
      auVar131 = vfmadd231ps_fma(auVar72,auVar275,auVar66);
      auVar246 = vfmadd231ps_fma(auVar157,auVar275,auVar96);
      auVar254 = vshufps_avx(auVar131,auVar131,0xe8);
      auVar158 = vshufps_avx(auVar246,auVar246,0xe8);
      auVar217 = vcmpps_avx(auVar254,auVar158,1);
      uVar53 = vextractps_avx(auVar217,0);
      auVar67 = auVar246;
      if ((uVar53 & 1) == 0) {
        auVar67 = auVar131;
      }
      auVar127._0_4_ = fVar124 * auVar81._16_4_ * 3.0;
      auVar127._4_4_ = fVar124 * fVar233;
      auVar127._8_4_ = fVar124 * auVar81._24_4_ * 3.0;
      auVar127._12_4_ = fVar124 * auVar231._28_4_;
      auVar94 = vsubps_avx((undefined1  [16])0x0,auVar127);
      auVar128 = vshufps_avx(auVar94,auVar94,0xb1);
      auVar92 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar192._0_4_ = fVar85 * auVar128._0_4_;
      auVar192._4_4_ = fVar87 * auVar128._4_4_;
      auVar192._8_4_ = fVar149 * auVar128._8_4_;
      auVar192._12_4_ = fVar61 * auVar128._12_4_;
      auVar208._0_4_ = auVar92._0_4_ * fVar85;
      auVar208._4_4_ = auVar92._4_4_ * fVar87;
      auVar208._8_4_ = auVar92._8_4_ * fVar149;
      auVar208._12_4_ = auVar92._12_4_ * fVar61;
      _local_418 = auVar94;
      auVar112 = vfmadd231ps_fma(auVar192,auVar275,auVar94);
      auVar113 = vfmadd231ps_fma(auVar208,(undefined1  [16])0x0,auVar275);
      auVar92 = vshufps_avx(auVar112,auVar112,0xe8);
      auVar93 = vshufps_avx(auVar113,auVar113,0xe8);
      auVar231 = ZEXT1664(auVar93);
      auVar128 = vcmpps_avx(auVar92,auVar93,1);
      uVar53 = vextractps_avx(auVar128,0);
      auVar126 = auVar113;
      if ((uVar53 & 1) == 0) {
        auVar126 = auVar112;
      }
      auVar67 = vmaxss_avx(auVar126,auVar67);
      auVar254 = vminps_avx(auVar254,auVar158);
      auVar158 = vminps_avx(auVar92,auVar93);
      auVar158 = vminps_avx(auVar254,auVar158);
      auVar217 = vshufps_avx(auVar217,auVar217,0x55);
      auVar217 = vblendps_avx(auVar217,auVar128,2);
      auVar128 = vpslld_avx(auVar217,0x1f);
      auVar217 = vshufpd_avx(auVar246,auVar246,1);
      auVar217 = vinsertps_avx(auVar217,auVar113,0x9c);
      auVar254 = vshufpd_avx(auVar131,auVar131,1);
      auVar254 = vinsertps_avx(auVar254,auVar112,0x9c);
      auVar217 = vblendvps_avx(auVar254,auVar217,auVar128);
      auVar254 = vmovshdup_avx(auVar217);
      auVar217 = vmaxss_avx(auVar254,auVar217);
      fVar149 = auVar158._0_4_;
      auVar254 = vmovshdup_avx(auVar158);
      fVar87 = auVar217._0_4_;
      fVar124 = auVar254._0_4_;
      fVar85 = auVar67._0_4_;
      if (((0.0001 <= fVar149) || (fVar87 <= -0.0001)) && (0.0001 <= fVar124 || fVar87 <= -0.0001))
      goto code_r0x011348cd;
      goto LAB_011348f3;
    }
    auVar10 = vinsertps_avx(auVar10,auVar151,0x10);
    goto LAB_01134019;
  }
  if (bVar56) goto LAB_0113547a;
  uVar60 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar80._4_4_ = uVar60;
  auVar80._0_4_ = uVar60;
  auVar80._8_4_ = uVar60;
  auVar80._12_4_ = uVar60;
  auVar10 = vcmpps_avx(auVar204,auVar80,2);
  uVar54 = vmovmskps_avx(auVar10);
  uVar54 = (uint)uVar57 & uVar54;
  goto LAB_01133810;
code_r0x011348cd:
  auVar254 = vcmpps_avx(auVar254,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar131 = vcmpps_avx(auVar158,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar254 = vandps_avx(auVar131,auVar254);
  if (fVar85 <= -0.0001 || (auVar254 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
  goto LAB_011345c7;
LAB_011348f3:
  auVar131 = vcmpps_avx(auVar158,_DAT_01f45a50,1);
  auVar246 = SUB6416(ZEXT864(0),0) << 0x20;
  auVar254 = vcmpss_avx(auVar67,ZEXT816(0) << 0x20,1);
  auVar97._8_4_ = 0x3f800000;
  auVar97._0_8_ = 0x3f8000003f800000;
  auVar97._12_4_ = 0x3f800000;
  auVar115._8_4_ = 0xbf800000;
  auVar115._0_8_ = 0xbf800000bf800000;
  auVar115._12_4_ = 0xbf800000;
  auVar254 = vblendvps_avx(auVar97,auVar115,auVar254);
  auVar131 = vblendvps_avx(auVar97,auVar115,auVar131);
  fVar233 = auVar131._0_4_;
  fVar61 = auVar254._0_4_;
  auVar254 = SUB6416(ZEXT864(0),0) << 0x20;
  if ((fVar233 == fVar61) && (!NAN(fVar233) && !NAN(fVar61))) {
    auVar254 = SUB6416(ZEXT464(0x7f800000),0);
  }
  if ((fVar233 == fVar61) && (!NAN(fVar233) && !NAN(fVar61))) {
    auVar246 = SUB6416(ZEXT464(0xff800000),0);
  }
  auVar131 = vmovshdup_avx(auVar131);
  fVar137 = auVar131._0_4_;
  if ((fVar233 != fVar137) || (NAN(fVar233) || NAN(fVar137))) {
    if ((fVar124 != fVar149) || (NAN(fVar124) || NAN(fVar149))) {
      auVar129._0_4_ = (float)((uint)fVar149 ^ local_438);
      auVar129._4_4_ = auVar158._4_4_ ^ uStack_434;
      auVar129._8_4_ = auVar158._8_4_ ^ uStack_430;
      auVar129._12_4_ = auVar158._12_4_ ^ uStack_42c;
      auVar130._0_4_ = auVar129._0_4_ / (fVar124 - fVar149);
      auVar130._4_12_ = auVar129._4_12_;
      auVar158 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar130._0_4_)),auVar130,ZEXT416(0));
      auVar131 = auVar158;
    }
    else {
      auVar158 = ZEXT816(0) << 0x20;
      if ((fVar149 != 0.0) || (auVar131 = SUB6416(ZEXT464(0x3f800000),0), NAN(fVar149))) {
        auVar158 = SUB6416(ZEXT464(0x7f800000),0);
        auVar131 = SUB6416(ZEXT464(0xff800000),0);
      }
    }
    auVar254 = vminss_avx(auVar254,auVar158);
    auVar246 = vmaxss_avx(auVar131,auVar246);
  }
  auVar217 = vcmpss_avx(auVar217,ZEXT416(0),1);
  auVar98._8_4_ = 0x3f800000;
  auVar98._0_8_ = 0x3f8000003f800000;
  auVar98._12_4_ = 0x3f800000;
  auVar116._8_4_ = 0xbf800000;
  auVar116._0_8_ = 0xbf800000bf800000;
  auVar116._12_4_ = 0xbf800000;
  auVar217 = vblendvps_avx(auVar98,auVar116,auVar217);
  fVar124 = auVar217._0_4_;
  if ((fVar61 != fVar124) || (NAN(fVar61) || NAN(fVar124))) {
    if ((fVar87 != fVar85) || (NAN(fVar87) || NAN(fVar85))) {
      auVar73._0_4_ = (float)((uint)fVar85 ^ local_438);
      auVar73._4_4_ = auVar67._4_4_ ^ uStack_434;
      auVar73._8_4_ = auVar67._8_4_ ^ uStack_430;
      auVar73._12_4_ = auVar67._12_4_ ^ uStack_42c;
      auVar132._0_4_ = auVar73._0_4_ / (fVar87 - fVar85);
      auVar132._4_12_ = auVar73._4_12_;
      auVar217 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar132._0_4_)),auVar132,ZEXT416(0));
      auVar158 = auVar217;
    }
    else {
      auVar217 = SUB6416(ZEXT464(0x3f800000),0);
      if ((fVar85 != 0.0) || (auVar158 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar85))) {
        auVar217 = SUB6416(ZEXT464(0xff800000),0);
        auVar158 = SUB6416(ZEXT464(0x7f800000),0);
      }
    }
    auVar254 = vminss_avx(auVar254,auVar158);
    auVar246 = vmaxss_avx(auVar217,auVar246);
  }
  if ((fVar137 != fVar124) || (NAN(fVar137) || NAN(fVar124))) {
    auVar254 = vminss_avx(auVar254,SUB6416(ZEXT464(0x3f800000),0));
    auVar246 = vmaxss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar246);
  }
  auVar217 = vmaxss_avx(ZEXT816(0) << 0x40,auVar254);
  auVar254 = vminss_avx(auVar246,SUB6416(ZEXT464(0x3f800000),0));
  if (auVar254._0_4_ < auVar217._0_4_) goto LAB_011345c7;
  auVar217 = vmaxss_avx(ZEXT816(0),ZEXT416((uint)(auVar217._0_4_ + -0.1)));
  auVar254 = vminss_avx(ZEXT416((uint)(auVar254._0_4_ + 0.1)),SUB6416(ZEXT464(0x3f800000),0));
  auVar144._0_8_ = auVar66._0_8_;
  auVar144._8_8_ = auVar144._0_8_;
  auVar223._8_8_ = auVar96._0_8_;
  auVar223._0_8_ = auVar96._0_8_;
  auVar237._8_8_ = auVar94._0_8_;
  auVar237._0_8_ = auVar94._0_8_;
  auVar158 = vshufpd_avx(auVar96,auVar96,3);
  auVar131 = vshufpd_avx(auVar94,auVar94,3);
  auVar246 = vshufps_avx(auVar217,auVar254,0);
  auVar74._8_4_ = 0x3f800000;
  auVar74._0_8_ = 0x3f8000003f800000;
  auVar74._12_4_ = 0x3f800000;
  auVar66 = vsubps_avx(auVar74,auVar246);
  local_508._0_4_ = auVar218._0_4_;
  local_508._4_4_ = auVar218._4_4_;
  fStack_500 = auVar218._8_4_;
  fStack_4fc = auVar218._12_4_;
  fVar124 = auVar246._0_4_;
  auVar75._0_4_ = fVar124 * (float)local_508._0_4_;
  fVar85 = auVar246._4_4_;
  auVar75._4_4_ = fVar85 * (float)local_508._4_4_;
  fVar87 = auVar246._8_4_;
  auVar75._8_4_ = fVar87 * fStack_500;
  fVar149 = auVar246._12_4_;
  auVar75._12_4_ = fVar149 * fStack_4fc;
  auVar181._0_4_ = fVar124 * auVar158._0_4_;
  auVar181._4_4_ = fVar85 * auVar158._4_4_;
  auVar181._8_4_ = fVar87 * auVar158._8_4_;
  auVar181._12_4_ = fVar149 * auVar158._12_4_;
  auVar193._0_4_ = fVar124 * auVar131._0_4_;
  auVar193._4_4_ = fVar85 * auVar131._4_4_;
  auVar193._8_4_ = fVar87 * auVar131._8_4_;
  auVar193._12_4_ = fVar149 * auVar131._12_4_;
  auVar209._0_4_ = fVar124 * auVar234._0_4_;
  auVar209._4_4_ = fVar85 * auVar234._4_4_;
  auVar209._8_4_ = fVar87 * auVar234._8_4_;
  auVar209._12_4_ = fVar149 * auVar234._12_4_;
  auVar158 = vfmadd231ps_fma(auVar75,auVar66,auVar144);
  auVar131 = vfmadd231ps_fma(auVar181,auVar66,auVar223);
  auVar246 = vfmadd231ps_fma(auVar193,auVar66,auVar237);
  auVar66 = vfmadd231ps_fma(auVar209,auVar66,ZEXT816(0));
  auVar218 = vmovshdup_avx(auVar68);
  auVar93 = vfmadd231ss_fma(ZEXT416((uint)(auVar218._0_4_ * auVar217._0_4_)),auVar68,
                            ZEXT416((uint)(1.0 - auVar217._0_4_)));
  auVar94 = vfmadd231ss_fma(ZEXT416((uint)(auVar218._0_4_ * auVar254._0_4_)),auVar68,
                            ZEXT416((uint)(1.0 - auVar254._0_4_)));
  fVar124 = 1.0 / fVar86;
  auVar217 = vsubps_avx(auVar131,auVar158);
  auVar224._0_4_ = auVar217._0_4_ * 3.0;
  auVar224._4_4_ = auVar217._4_4_ * 3.0;
  auVar224._8_4_ = auVar217._8_4_ * 3.0;
  auVar224._12_4_ = auVar217._12_4_ * 3.0;
  auVar217 = vsubps_avx(auVar246,auVar131);
  auVar238._0_4_ = auVar217._0_4_ * 3.0;
  auVar238._4_4_ = auVar217._4_4_ * 3.0;
  auVar238._8_4_ = auVar217._8_4_ * 3.0;
  auVar238._12_4_ = auVar217._12_4_ * 3.0;
  auVar217 = vsubps_avx(auVar66,auVar246);
  auVar247._0_4_ = auVar217._0_4_ * 3.0;
  auVar247._4_4_ = auVar217._4_4_ * 3.0;
  auVar247._8_4_ = auVar217._8_4_ * 3.0;
  auVar247._12_4_ = auVar217._12_4_ * 3.0;
  auVar218 = vminps_avx(auVar238,auVar247);
  auVar217 = vmaxps_avx(auVar238,auVar247);
  auVar218 = vminps_avx(auVar224,auVar218);
  auVar217 = vmaxps_avx(auVar224,auVar217);
  auVar234 = vshufpd_avx(auVar218,auVar218,3);
  auVar254 = vshufpd_avx(auVar217,auVar217,3);
  auVar218 = vminps_avx(auVar218,auVar234);
  auVar217 = vmaxps_avx(auVar217,auVar254);
  auVar239._0_4_ = auVar218._0_4_ * fVar124;
  auVar239._4_4_ = auVar218._4_4_ * fVar124;
  auVar239._8_4_ = auVar218._8_4_ * fVar124;
  auVar239._12_4_ = auVar218._12_4_ * fVar124;
  auVar225._0_4_ = auVar217._0_4_ * fVar124;
  auVar225._4_4_ = auVar217._4_4_ * fVar124;
  auVar225._8_4_ = auVar217._8_4_ * fVar124;
  auVar225._12_4_ = auVar217._12_4_ * fVar124;
  fVar124 = 1.0 / (auVar94._0_4_ - auVar93._0_4_);
  auVar217 = vshufpd_avx(auVar158,auVar158,3);
  auVar218 = vshufpd_avx(auVar131,auVar131,3);
  auVar234 = vshufpd_avx(auVar246,auVar246,3);
  auVar254 = vshufpd_avx(auVar66,auVar66,3);
  auVar217 = vsubps_avx(auVar217,auVar158);
  auVar158 = vsubps_avx(auVar218,auVar131);
  auVar68 = vsubps_avx(auVar234,auVar246);
  auVar254 = vsubps_avx(auVar254,auVar66);
  auVar218 = vminps_avx(auVar217,auVar158);
  auVar217 = vmaxps_avx(auVar217,auVar158);
  auVar234 = vminps_avx(auVar68,auVar254);
  auVar234 = vminps_avx(auVar218,auVar234);
  auVar218 = vmaxps_avx(auVar68,auVar254);
  auVar217 = vmaxps_avx(auVar217,auVar218);
  auVar265._0_4_ = fVar124 * auVar234._0_4_;
  auVar265._4_4_ = fVar124 * auVar234._4_4_;
  auVar265._8_4_ = fVar124 * auVar234._8_4_;
  auVar265._12_4_ = fVar124 * auVar234._12_4_;
  auVar255._0_4_ = fVar124 * auVar217._0_4_;
  auVar255._4_4_ = fVar124 * auVar217._4_4_;
  auVar255._8_4_ = fVar124 * auVar217._8_4_;
  auVar255._12_4_ = fVar124 * auVar217._12_4_;
  auVar254 = vinsertps_avx(auVar10,auVar93,0x10);
  auVar158 = vinsertps_avx(auVar151,auVar94,0x10);
  auVar248._0_4_ = (auVar254._0_4_ + auVar158._0_4_) * 0.5;
  auVar248._4_4_ = (auVar254._4_4_ + auVar158._4_4_) * 0.5;
  auVar248._8_4_ = (auVar254._8_4_ + auVar158._8_4_) * 0.5;
  auVar248._12_4_ = (auVar254._12_4_ + auVar158._12_4_) * 0.5;
  auVar76._4_4_ = auVar248._0_4_;
  auVar76._0_4_ = auVar248._0_4_;
  auVar76._8_4_ = auVar248._0_4_;
  auVar76._12_4_ = auVar248._0_4_;
  auVar217 = vfmadd213ps_fma(auVar11,auVar76,auVar14);
  auVar218 = vfmadd213ps_fma(auVar13,auVar76,auVar15);
  auVar234 = vfmadd213ps_fma(auVar140,auVar76,auVar16);
  auVar151 = vsubps_avx(auVar218,auVar217);
  auVar217 = vfmadd213ps_fma(auVar151,auVar76,auVar217);
  auVar151 = vsubps_avx(auVar234,auVar218);
  auVar151 = vfmadd213ps_fma(auVar151,auVar76,auVar218);
  auVar151 = vsubps_avx(auVar151,auVar217);
  auVar217 = vfmadd231ps_fma(auVar217,auVar151,auVar76);
  auVar77._0_8_ = CONCAT44(auVar151._4_4_ * 3.0,auVar151._0_4_ * 3.0);
  auVar77._8_4_ = auVar151._8_4_ * 3.0;
  auVar77._12_4_ = auVar151._12_4_ * 3.0;
  auVar276._8_8_ = auVar217._0_8_;
  auVar276._0_8_ = auVar217._0_8_;
  auVar151 = vshufpd_avx(auVar217,auVar217,3);
  auVar217 = vshufps_avx(auVar248,auVar248,0x55);
  auVar131 = vsubps_avx(auVar151,auVar276);
  auVar66 = vfmadd231ps_fma(auVar276,auVar217,auVar131);
  auVar282._8_8_ = auVar77._0_8_;
  auVar282._0_8_ = auVar77._0_8_;
  auVar151 = vshufpd_avx(auVar77,auVar77,3);
  auVar151 = vsubps_avx(auVar151,auVar282);
  auVar246 = vfmadd213ps_fma(auVar151,auVar217,auVar282);
  auVar217 = vmovshdup_avx(auVar246);
  auVar283._0_8_ = auVar217._0_8_ ^ 0x8000000080000000;
  auVar283._8_4_ = auVar217._8_4_ ^ 0x80000000;
  auVar283._12_4_ = auVar217._12_4_ ^ 0x80000000;
  auVar218 = vmovshdup_avx(auVar131);
  auVar151 = vunpcklps_avx(auVar218,auVar283);
  auVar234 = vshufps_avx(auVar151,auVar283,4);
  auVar68 = vshufps_avx(auVar248,auVar248,0x54);
  auVar133._0_8_ = auVar131._0_8_ ^ 0x8000000080000000;
  auVar133._8_4_ = auVar131._8_4_ ^ 0x80000000;
  auVar133._12_4_ = auVar131._12_4_ ^ 0x80000000;
  auVar151 = vmovlhps_avx(auVar133,auVar246);
  auVar151 = vshufps_avx(auVar151,auVar246,8);
  auVar217 = vfmsub231ss_fma(ZEXT416((uint)(auVar131._0_4_ * auVar217._0_4_)),auVar218,auVar246);
  uVar60 = auVar217._0_4_;
  auVar78._4_4_ = uVar60;
  auVar78._0_4_ = uVar60;
  auVar78._8_4_ = uVar60;
  auVar78._12_4_ = uVar60;
  auVar217 = vdivps_avx(auVar234,auVar78);
  auVar218 = vdivps_avx(auVar151,auVar78);
  fVar87 = auVar66._0_4_;
  fVar124 = auVar217._0_4_;
  auVar151 = vshufps_avx(auVar66,auVar66,0x55);
  fVar85 = auVar218._0_4_;
  auVar79._0_4_ = fVar87 * fVar124 + auVar151._0_4_ * fVar85;
  auVar79._4_4_ = fVar87 * auVar217._4_4_ + auVar151._4_4_ * auVar218._4_4_;
  auVar79._8_4_ = fVar87 * auVar217._8_4_ + auVar151._8_4_ * auVar218._8_4_;
  auVar79._12_4_ = fVar87 * auVar217._12_4_ + auVar151._12_4_ * auVar218._12_4_;
  auVar92 = vsubps_avx(auVar68,auVar79);
  auVar68 = vmovshdup_avx(auVar217);
  auVar151 = vinsertps_avx(auVar239,auVar265,0x1c);
  auVar159._0_4_ = auVar68._0_4_ * auVar151._0_4_;
  auVar159._4_4_ = auVar68._4_4_ * auVar151._4_4_;
  auVar159._8_4_ = auVar68._8_4_ * auVar151._8_4_;
  auVar159._12_4_ = auVar68._12_4_ * auVar151._12_4_;
  auVar234 = vinsertps_avx(auVar225,auVar255,0x1c);
  auVar99._0_4_ = auVar234._0_4_ * auVar68._0_4_;
  auVar99._4_4_ = auVar234._4_4_ * auVar68._4_4_;
  auVar99._8_4_ = auVar234._8_4_ * auVar68._8_4_;
  auVar99._12_4_ = auVar234._12_4_ * auVar68._12_4_;
  auVar66 = vminps_avx(auVar159,auVar99);
  auVar246 = vmaxps_avx(auVar99,auVar159);
  auVar68 = vinsertps_avx(auVar265,auVar239,0x4c);
  auVar67 = vmovshdup_avx(auVar218);
  auVar131 = vinsertps_avx(auVar255,auVar225,0x4c);
  auVar256._0_4_ = auVar67._0_4_ * auVar68._0_4_;
  auVar256._4_4_ = auVar67._4_4_ * auVar68._4_4_;
  auVar256._8_4_ = auVar67._8_4_ * auVar68._8_4_;
  auVar256._12_4_ = auVar67._12_4_ * auVar68._12_4_;
  auVar240._0_4_ = auVar67._0_4_ * auVar131._0_4_;
  auVar240._4_4_ = auVar67._4_4_ * auVar131._4_4_;
  auVar240._8_4_ = auVar67._8_4_ * auVar131._8_4_;
  auVar240._12_4_ = auVar67._12_4_ * auVar131._12_4_;
  auVar67 = vminps_avx(auVar256,auVar240);
  auVar266._0_4_ = auVar66._0_4_ + auVar67._0_4_;
  auVar266._4_4_ = auVar66._4_4_ + auVar67._4_4_;
  auVar266._8_4_ = auVar66._8_4_ + auVar67._8_4_;
  auVar266._12_4_ = auVar66._12_4_ + auVar67._12_4_;
  auVar66 = vmaxps_avx(auVar240,auVar256);
  auVar100._0_4_ = auVar66._0_4_ + auVar246._0_4_;
  auVar100._4_4_ = auVar66._4_4_ + auVar246._4_4_;
  auVar100._8_4_ = auVar66._8_4_ + auVar246._8_4_;
  auVar100._12_4_ = auVar66._12_4_ + auVar246._12_4_;
  auVar241._8_8_ = 0x3f80000000000000;
  auVar241._0_8_ = 0x3f80000000000000;
  auVar246 = vsubps_avx(auVar241,auVar100);
  auVar66 = vsubps_avx(auVar241,auVar266);
  auVar67 = vsubps_avx(auVar254,auVar248);
  auVar128 = vsubps_avx(auVar158,auVar248);
  auVar117._0_4_ = fVar124 * auVar151._0_4_;
  auVar117._4_4_ = fVar124 * auVar151._4_4_;
  auVar117._8_4_ = fVar124 * auVar151._8_4_;
  auVar117._12_4_ = fVar124 * auVar151._12_4_;
  auVar267._0_4_ = fVar124 * auVar234._0_4_;
  auVar267._4_4_ = fVar124 * auVar234._4_4_;
  auVar267._8_4_ = fVar124 * auVar234._8_4_;
  auVar267._12_4_ = fVar124 * auVar234._12_4_;
  auVar234 = vminps_avx(auVar117,auVar267);
  auVar151 = vmaxps_avx(auVar267,auVar117);
  auVar160._0_4_ = fVar85 * auVar68._0_4_;
  auVar160._4_4_ = fVar85 * auVar68._4_4_;
  auVar160._8_4_ = fVar85 * auVar68._8_4_;
  auVar160._12_4_ = fVar85 * auVar68._12_4_;
  auVar226._0_4_ = fVar85 * auVar131._0_4_;
  auVar226._4_4_ = fVar85 * auVar131._4_4_;
  auVar226._8_4_ = fVar85 * auVar131._8_4_;
  auVar226._12_4_ = fVar85 * auVar131._12_4_;
  auVar68 = vminps_avx(auVar160,auVar226);
  auVar268._0_4_ = auVar234._0_4_ + auVar68._0_4_;
  auVar268._4_4_ = auVar234._4_4_ + auVar68._4_4_;
  auVar268._8_4_ = auVar234._8_4_ + auVar68._8_4_;
  auVar268._12_4_ = auVar234._12_4_ + auVar68._12_4_;
  fVar137 = auVar67._0_4_;
  auVar277._0_4_ = fVar137 * auVar246._0_4_;
  fVar273 = auVar67._4_4_;
  auVar277._4_4_ = fVar273 * auVar246._4_4_;
  fVar197 = auVar67._8_4_;
  auVar277._8_4_ = fVar197 * auVar246._8_4_;
  fVar198 = auVar67._12_4_;
  auVar277._12_4_ = fVar198 * auVar246._12_4_;
  auVar234 = vmaxps_avx(auVar226,auVar160);
  auVar227._0_4_ = fVar137 * auVar66._0_4_;
  auVar227._4_4_ = fVar273 * auVar66._4_4_;
  auVar227._8_4_ = fVar197 * auVar66._8_4_;
  auVar227._12_4_ = fVar198 * auVar66._12_4_;
  fVar87 = auVar128._0_4_;
  auVar101._0_4_ = fVar87 * auVar246._0_4_;
  fVar149 = auVar128._4_4_;
  auVar101._4_4_ = fVar149 * auVar246._4_4_;
  fVar61 = auVar128._8_4_;
  auVar101._8_4_ = fVar61 * auVar246._8_4_;
  fVar233 = auVar128._12_4_;
  auVar101._12_4_ = fVar233 * auVar246._12_4_;
  auVar242._0_4_ = fVar87 * auVar66._0_4_;
  auVar242._4_4_ = fVar149 * auVar66._4_4_;
  auVar242._8_4_ = fVar61 * auVar66._8_4_;
  auVar242._12_4_ = fVar233 * auVar66._12_4_;
  auVar118._0_4_ = auVar151._0_4_ + auVar234._0_4_;
  auVar118._4_4_ = auVar151._4_4_ + auVar234._4_4_;
  auVar118._8_4_ = auVar151._8_4_ + auVar234._8_4_;
  auVar118._12_4_ = auVar151._12_4_ + auVar234._12_4_;
  auVar161._8_8_ = 0x3f800000;
  auVar161._0_8_ = 0x3f800000;
  auVar151 = vsubps_avx(auVar161,auVar118);
  auVar234 = vsubps_avx(auVar161,auVar268);
  auVar269._0_4_ = fVar137 * auVar151._0_4_;
  auVar269._4_4_ = fVar273 * auVar151._4_4_;
  auVar269._8_4_ = fVar197 * auVar151._8_4_;
  auVar269._12_4_ = fVar198 * auVar151._12_4_;
  auVar257._0_4_ = fVar137 * auVar234._0_4_;
  auVar257._4_4_ = fVar273 * auVar234._4_4_;
  auVar257._8_4_ = fVar197 * auVar234._8_4_;
  auVar257._12_4_ = fVar198 * auVar234._12_4_;
  auVar119._0_4_ = fVar87 * auVar151._0_4_;
  auVar119._4_4_ = fVar149 * auVar151._4_4_;
  auVar119._8_4_ = fVar61 * auVar151._8_4_;
  auVar119._12_4_ = fVar233 * auVar151._12_4_;
  auVar162._0_4_ = fVar87 * auVar234._0_4_;
  auVar162._4_4_ = fVar149 * auVar234._4_4_;
  auVar162._8_4_ = fVar61 * auVar234._8_4_;
  auVar162._12_4_ = fVar233 * auVar234._12_4_;
  auVar151 = vminps_avx(auVar269,auVar257);
  auVar234 = vminps_avx(auVar119,auVar162);
  auVar151 = vminps_avx(auVar151,auVar234);
  auVar234 = vmaxps_avx(auVar257,auVar269);
  auVar68 = vmaxps_avx(auVar162,auVar119);
  auVar131 = vminps_avx(auVar277,auVar227);
  auVar246 = vminps_avx(auVar101,auVar242);
  auVar131 = vminps_avx(auVar131,auVar246);
  auVar151 = vhaddps_avx(auVar151,auVar131);
  auVar234 = vmaxps_avx(auVar68,auVar234);
  auVar68 = vmaxps_avx(auVar227,auVar277);
  auVar131 = vmaxps_avx(auVar242,auVar101);
  auVar68 = vmaxps_avx(auVar131,auVar68);
  auVar234 = vhaddps_avx(auVar234,auVar68);
  auVar151 = vshufps_avx(auVar151,auVar151,0xe8);
  auVar234 = vshufps_avx(auVar234,auVar234,0xe8);
  auVar243._0_4_ = auVar92._0_4_ + auVar151._0_4_;
  auVar243._4_4_ = auVar92._4_4_ + auVar151._4_4_;
  auVar243._8_4_ = auVar92._8_4_ + auVar151._8_4_;
  auVar243._12_4_ = auVar92._12_4_ + auVar151._12_4_;
  auVar228._0_4_ = auVar92._0_4_ + auVar234._0_4_;
  auVar228._4_4_ = auVar92._4_4_ + auVar234._4_4_;
  auVar228._8_4_ = auVar92._8_4_ + auVar234._8_4_;
  auVar228._12_4_ = auVar92._12_4_ + auVar234._12_4_;
  auVar231 = ZEXT1664(auVar228);
  auVar151 = vmaxps_avx(auVar254,auVar243);
  auVar234 = vminps_avx(auVar228,auVar158);
  auVar151 = vcmpps_avx(auVar234,auVar151,1);
  auVar151 = vshufps_avx(auVar151,auVar151,0x50);
  if ((auVar151 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 || auVar151[0xf] < '\0')
  goto LAB_011345c7;
  bVar52 = 0;
  if ((auVar196._0_4_ < auVar243._0_4_) && (bVar52 = 0, auVar228._0_4_ < auVar158._0_4_)) {
    auVar234 = vmovshdup_avx(auVar243);
    auVar151 = vcmpps_avx(auVar228,auVar158,1);
    bVar52 = auVar151[4] & auVar93._0_4_ < auVar234._0_4_;
  }
  auVar231 = ZEXT464(0x40400000);
  p03.field_0.i[0] = auVar65._0_4_;
  p03.field_0.i[1] = auVar65._4_4_;
  p03.field_0.i[2] = auVar65._8_4_;
  p03.field_0.i[3] = auVar65._12_4_;
  if (((3 < (uint)uVar50 || fVar86 < 0.001) | bVar52) == 1) {
    lVar51 = 0xc9;
    do {
      lVar51 = lVar51 + -1;
      if (lVar51 == 0) goto LAB_011345c7;
      fVar149 = auVar92._0_4_;
      fVar87 = 1.0 - fVar149;
      fVar86 = fVar87 * fVar87 * fVar87;
      fVar88 = fVar149 * 3.0 * fVar87 * fVar87;
      fVar87 = fVar87 * fVar149 * fVar149 * 3.0;
      auVar145._4_4_ = fVar86;
      auVar145._0_4_ = fVar86;
      auVar145._8_4_ = fVar86;
      auVar145._12_4_ = fVar86;
      auVar120._4_4_ = fVar88;
      auVar120._0_4_ = fVar88;
      auVar120._8_4_ = fVar88;
      auVar120._12_4_ = fVar88;
      auVar102._4_4_ = fVar87;
      auVar102._0_4_ = fVar87;
      auVar102._8_4_ = fVar87;
      auVar102._12_4_ = fVar87;
      fVar149 = fVar149 * fVar149 * fVar149;
      auVar163._0_4_ = p03.field_0.v[0] * fVar149;
      auVar163._4_4_ = p03.field_0.v[1] * fVar149;
      auVar163._8_4_ = p03.field_0.v[2] * fVar149;
      auVar163._12_4_ = p03.field_0.v[3] * fVar149;
      auVar10 = vfmadd231ps_fma(auVar163,auVar16,auVar102);
      auVar10 = vfmadd231ps_fma(auVar10,auVar15,auVar120);
      auVar10 = vfmadd231ps_fma(auVar10,auVar14,auVar145);
      auVar103._8_8_ = auVar10._0_8_;
      auVar103._0_8_ = auVar10._0_8_;
      auVar10 = vshufpd_avx(auVar10,auVar10,3);
      auVar151 = vshufps_avx(auVar92,auVar92,0x55);
      auVar10 = vsubps_avx(auVar10,auVar103);
      auVar151 = vfmadd213ps_fma(auVar10,auVar151,auVar103);
      fVar86 = auVar151._0_4_;
      auVar10 = vshufps_avx(auVar151,auVar151,0x55);
      auVar104._0_4_ = fVar124 * fVar86 + fVar85 * auVar10._0_4_;
      auVar104._4_4_ = auVar217._4_4_ * fVar86 + auVar218._4_4_ * auVar10._4_4_;
      auVar104._8_4_ = auVar217._8_4_ * fVar86 + auVar218._8_4_ * auVar10._8_4_;
      auVar104._12_4_ = auVar217._12_4_ * fVar86 + auVar218._12_4_ * auVar10._12_4_;
      auVar92 = vsubps_avx(auVar92,auVar104);
      auVar10 = vandps_avx(local_428,auVar151);
      auVar151 = vshufps_avx(auVar10,auVar10,0xf5);
      auVar10 = vmaxss_avx(auVar151,auVar10);
    } while (fVar84 <= auVar10._0_4_);
    local_218 = auVar92._0_4_;
    if ((0.0 <= local_218) && (local_218 <= 1.0)) {
      auVar10 = vmovshdup_avx(auVar92);
      fVar86 = auVar10._0_4_;
      if ((0.0 <= fVar86) && (fVar86 <= 1.0)) {
        auVar10 = vinsertps_avx(ZEXT416((uint)(pLVar48->vx).field_0.m128[2]),
                                ZEXT416(*(uint *)((long)&(pLVar48->vy).field_0 + 8)),0x1c);
        auVar68 = vinsertps_avx(auVar10,ZEXT416(*(uint *)((long)&(pLVar48->vz).field_0 + 8)),0x28);
        auVar10 = vdpps_avx(auVar68,local_448,0x7f);
        auVar151 = vdpps_avx(auVar68,local_458,0x7f);
        auVar217 = vdpps_avx(auVar68,auVar64,0x7f);
        auVar218 = vdpps_avx(auVar68,auVar110,0x7f);
        auVar234 = vdpps_avx(auVar68,auVar91,0x7f);
        auVar254 = vdpps_avx(auVar68,auVar63,0x7f);
        auVar158 = vdpps_avx(auVar68,auVar111,0x7f);
        auVar68 = vdpps_avx(auVar68,auVar125,0x7f);
        fVar88 = 1.0 - fVar86;
        auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar86 * auVar234._0_4_)),ZEXT416((uint)fVar88),
                                  auVar10);
        auVar151 = vfmadd231ss_fma(ZEXT416((uint)(auVar254._0_4_ * fVar86)),ZEXT416((uint)fVar88),
                                   auVar151);
        auVar217 = vfmadd231ss_fma(ZEXT416((uint)(auVar158._0_4_ * fVar86)),ZEXT416((uint)fVar88),
                                   auVar217);
        auVar231 = ZEXT1664(auVar217);
        auVar218 = vfmadd231ss_fma(ZEXT416((uint)(fVar86 * auVar68._0_4_)),ZEXT416((uint)fVar88),
                                   auVar218);
        fVar85 = 1.0 - local_218;
        fVar86 = fVar85 * local_218 * local_218 * 3.0;
        fVar149 = local_218 * local_218 * local_218;
        auVar217 = vfmadd231ss_fma(ZEXT416((uint)(auVar218._0_4_ * fVar149)),ZEXT416((uint)fVar86),
                                   auVar217);
        fVar88 = local_218 * 3.0 * fVar85 * fVar85;
        auVar151 = vfmadd231ss_fma(auVar217,ZEXT416((uint)fVar88),auVar151);
        fVar124 = fVar85 * fVar85 * fVar85;
        auVar10 = vfmadd231ss_fma(auVar151,ZEXT416((uint)fVar124),auVar10);
        fVar87 = auVar10._0_4_;
        if ((fVar59 <= fVar87) && (fVar61 = *(float *)(ray + k * 4 + 0x80), fVar87 <= fVar61)) {
          pGVar6 = (context->scene->geometries).items[uVar54].ptr;
          if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
            bVar58 = false;
          }
          else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                  (bVar58 = true, pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
            local_208 = vshufps_avx(auVar92,auVar92,0x55);
            auVar210._8_4_ = 0x3f800000;
            auVar210._0_8_ = 0x3f8000003f800000;
            auVar210._12_4_ = 0x3f800000;
            auVar10 = vsubps_avx(auVar210,local_208);
            fVar233 = local_208._0_4_;
            auVar229._0_4_ = fVar233 * (float)local_478._0_4_;
            fVar137 = local_208._4_4_;
            auVar229._4_4_ = fVar137 * (float)local_478._4_4_;
            fVar273 = local_208._8_4_;
            auVar229._8_4_ = fVar273 * fStack_470;
            fVar197 = local_208._12_4_;
            auVar229._12_4_ = fVar197 * fStack_46c;
            auVar244._0_4_ = fVar233 * (float)local_4b8._0_4_;
            auVar244._4_4_ = fVar137 * (float)local_4b8._4_4_;
            auVar244._8_4_ = fVar273 * fStack_4b0;
            auVar244._12_4_ = fVar197 * fStack_4ac;
            auVar249._0_4_ = fVar233 * (float)local_4c8._0_4_;
            auVar249._4_4_ = fVar137 * (float)local_4c8._4_4_;
            auVar249._8_4_ = fVar273 * fStack_4c0;
            auVar249._12_4_ = fVar197 * fStack_4bc;
            auVar258._0_4_ = fVar233 * fVar166;
            auVar258._4_4_ = fVar137 * fVar184;
            auVar258._8_4_ = fVar273 * fVar185;
            auVar258._12_4_ = fVar197 * fVar186;
            auVar151 = vfmadd231ps_fma(auVar229,auVar10,local_468);
            auVar217 = vfmadd231ps_fma(auVar244,auVar10,local_498);
            auVar218 = vfmadd231ps_fma(auVar249,auVar10,local_4a8);
            auVar234 = vfmadd231ps_fma(auVar258,auVar10,local_488);
            auVar10 = vsubps_avx(auVar217,auVar151);
            auVar151 = vsubps_avx(auVar218,auVar217);
            auVar231 = ZEXT1664(auVar151);
            auVar217 = vsubps_avx(auVar234,auVar218);
            auVar250._0_4_ = auVar151._0_4_ * local_218;
            auVar250._4_4_ = auVar151._4_4_ * local_218;
            auVar250._8_4_ = auVar151._8_4_ * local_218;
            auVar250._12_4_ = auVar151._12_4_ * local_218;
            auVar182._4_4_ = fVar85;
            auVar182._0_4_ = fVar85;
            auVar182._8_4_ = fVar85;
            auVar182._12_4_ = fVar85;
            auVar10 = vfmadd231ps_fma(auVar250,auVar182,auVar10);
            auVar211._0_4_ = auVar217._0_4_ * local_218;
            auVar211._4_4_ = auVar217._4_4_ * local_218;
            auVar211._8_4_ = auVar217._8_4_ * local_218;
            auVar211._12_4_ = auVar217._12_4_ * local_218;
            auVar217 = vfmadd231ps_fma(auVar211,auVar182,auVar151);
            auVar212._0_4_ = auVar217._0_4_ * local_218;
            auVar212._4_4_ = auVar217._4_4_ * local_218;
            auVar212._8_4_ = auVar217._8_4_ * local_218;
            auVar212._12_4_ = auVar217._12_4_ * local_218;
            auVar217 = vfmadd231ps_fma(auVar212,auVar182,auVar10);
            local_398 = auVar150._0_4_;
            fStack_394 = auVar150._4_4_;
            fStack_390 = auVar150._8_4_;
            fStack_38c = auVar150._12_4_;
            auVar164._0_4_ = fVar149 * local_398;
            auVar164._4_4_ = fVar149 * fStack_394;
            auVar164._8_4_ = fVar149 * fStack_390;
            auVar164._12_4_ = fVar149 * fStack_38c;
            auVar121._4_4_ = fVar86;
            auVar121._0_4_ = fVar86;
            auVar121._8_4_ = fVar86;
            auVar121._12_4_ = fVar86;
            auVar10 = vfmadd132ps_fma(auVar121,auVar164,auVar139);
            auVar146._4_4_ = fVar88;
            auVar146._0_4_ = fVar88;
            auVar146._8_4_ = fVar88;
            auVar146._12_4_ = fVar88;
            auVar10 = vfmadd132ps_fma(auVar146,auVar10,auVar90);
            auVar122._0_4_ = auVar217._0_4_ * 3.0;
            auVar122._4_4_ = auVar217._4_4_ * 3.0;
            auVar122._8_4_ = auVar217._8_4_ * 3.0;
            auVar122._12_4_ = auVar217._12_4_ * 3.0;
            auVar134._4_4_ = fVar124;
            auVar134._0_4_ = fVar124;
            auVar134._8_4_ = fVar124;
            auVar134._12_4_ = fVar124;
            auVar217 = vfmadd132ps_fma(auVar134,auVar10,auVar62);
            auVar10 = vshufps_avx(auVar122,auVar122,0xc9);
            auVar147._0_4_ = auVar217._0_4_ * auVar10._0_4_;
            auVar147._4_4_ = auVar217._4_4_ * auVar10._4_4_;
            auVar147._8_4_ = auVar217._8_4_ * auVar10._8_4_;
            auVar147._12_4_ = auVar217._12_4_ * auVar10._12_4_;
            auVar10 = vshufps_avx(auVar217,auVar217,0xc9);
            auVar217 = vfmsub231ps_fma(auVar147,auVar122,auVar10);
            auVar10 = vshufps_avx(auVar217,auVar217,0x55);
            local_248[0] = (RTCHitN)auVar10[0];
            local_248[1] = (RTCHitN)auVar10[1];
            local_248[2] = (RTCHitN)auVar10[2];
            local_248[3] = (RTCHitN)auVar10[3];
            local_248[4] = (RTCHitN)auVar10[4];
            local_248[5] = (RTCHitN)auVar10[5];
            local_248[6] = (RTCHitN)auVar10[6];
            local_248[7] = (RTCHitN)auVar10[7];
            local_248[8] = (RTCHitN)auVar10[8];
            local_248[9] = (RTCHitN)auVar10[9];
            local_248[10] = (RTCHitN)auVar10[10];
            local_248[0xb] = (RTCHitN)auVar10[0xb];
            local_248[0xc] = (RTCHitN)auVar10[0xc];
            local_248[0xd] = (RTCHitN)auVar10[0xd];
            local_248[0xe] = (RTCHitN)auVar10[0xe];
            local_248[0xf] = (RTCHitN)auVar10[0xf];
            local_238 = vshufps_avx(auVar217,auVar217,0xaa);
            local_228 = auVar217._0_4_;
            uStack_224 = local_228;
            uStack_220 = local_228;
            uStack_21c = local_228;
            fStack_214 = local_218;
            fStack_210 = local_218;
            fStack_20c = local_218;
            local_1f8 = CONCAT44(uVar5,uVar5);
            uStack_1f0 = CONCAT44(uVar5,uVar5);
            local_1e8._4_4_ = uVar54;
            local_1e8._0_4_ = uVar54;
            local_1e8._8_4_ = uVar54;
            local_1e8._12_4_ = uVar54;
            vpcmpeqd_avx2(ZEXT1632(local_1e8),ZEXT1632(local_1e8));
            uStack_1d4 = context->user->instID[0];
            local_1d8 = uStack_1d4;
            uStack_1d0 = uStack_1d4;
            uStack_1cc = uStack_1d4;
            uStack_1c8 = context->user->instPrimID[0];
            uStack_1c4 = uStack_1c8;
            uStack_1c0 = uStack_1c8;
            uStack_1bc = uStack_1c8;
            *(float *)(ray + k * 4 + 0x80) = fVar87;
            local_538 = *local_520;
            args.valid = (int *)local_538;
            args.geometryUserPtr = pGVar6->userPtr;
            args.context = context->user;
            args.ray = (RTCRayN *)ray;
            args.hit = local_248;
            args.N = 4;
            if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
              auVar231 = ZEXT1664(auVar151);
              (*pGVar6->occlusionFilterN)(&args);
            }
            if (local_538 == (undefined1  [16])0x0) {
              auVar10 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
              auVar10 = auVar10 ^ _DAT_01f46b70;
            }
            else {
              p_Var7 = context->args->filter;
              if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                auVar231 = ZEXT1664(auVar231._0_16_);
                (*p_Var7)(&args);
              }
              auVar151 = vpcmpeqd_avx(local_538,_DAT_01f45a50);
              auVar10 = auVar151 ^ _DAT_01f46b70;
              auVar123._8_4_ = 0xff800000;
              auVar123._0_8_ = 0xff800000ff800000;
              auVar123._12_4_ = 0xff800000;
              auVar151 = vblendvps_avx(auVar123,*(undefined1 (*) [16])(args.ray + 0x80),auVar151);
              *(undefined1 (*) [16])(args.ray + 0x80) = auVar151;
            }
            auVar105._8_8_ = 0x100000001;
            auVar105._0_8_ = 0x100000001;
            bVar58 = (auVar105 & auVar10) != (undefined1  [16])0x0;
            if (!bVar58) {
              *(float *)(ray + k * 4 + 0x80) = fVar61;
            }
          }
          bVar56 = (bool)(bVar56 | bVar58);
        }
      }
    }
    goto LAB_011345c7;
  }
  auVar10 = vinsertps_avx(auVar10,ZEXT416((uint)fVar88),0x10);
  auVar68 = vinsertps_avx(auVar93,ZEXT416((uint)auVar94._0_4_),0x10);
  goto LAB_01134019;
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }